

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_16,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<16,_embree::avx512::TriangleMiMBIntersectorKMoeller<4,_16,_true>_>,_true>
     ::occluded(vint<16> *valid_i,Intersectors *This,RayK<16> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  Ref<embree::Geometry> *pRVar2;
  Geometry *pGVar3;
  long lVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  byte bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  ulong uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  size_t k;
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  bool bVar57;
  AABBNodeMB4D *node1;
  ulong uVar58;
  ushort uVar59;
  uint uVar60;
  long lVar61;
  long lVar62;
  undefined1 (*pauVar63) [64];
  ulong uVar64;
  ulong uVar65;
  long lVar66;
  vuint<4> *v;
  ulong *puVar67;
  NodeRef root;
  ulong uVar68;
  ulong uVar69;
  int iVar70;
  undefined1 auVar71 [16];
  int iVar96;
  int iVar97;
  int iVar99;
  int iVar100;
  int iVar101;
  int iVar102;
  int iVar103;
  int iVar104;
  int iVar105;
  int iVar106;
  int iVar107;
  int iVar108;
  int iVar109;
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  int iVar98;
  int iVar110;
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar111 [16];
  undefined1 auVar112 [64];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM21 [64];
  Precalculations pre;
  vint<16> itime;
  RTCFilterFunctionNArguments args;
  Vec3<embree::vfloat_impl<16>_> p1;
  Vec3<embree::vfloat_impl<16>_> p0;
  TravRayK<16,_false> tray;
  vfloat<16> t;
  vfloat<16> v_2;
  vfloat<16> u;
  NodeRef stack_node [561];
  vfloat<16> stack_near [561];
  uint local_a9f8;
  uint local_a9e0;
  Precalculations local_a9d9;
  RayQueryContext *local_a9d8;
  Geometry *local_a9d0;
  long local_a9c8;
  ulong local_a9c0;
  ulong local_a9b8;
  long local_a9b0;
  uint local_a9a8;
  undefined4 local_a9a4;
  RayK<16> *local_a9a0;
  BVH *local_a998;
  Intersectors *local_a990;
  long local_a988;
  undefined1 local_a980 [16];
  _Head_base<1UL,_embree::vfloat_impl<16>_&,_false> _Stack_a970;
  _Head_base<0UL,_embree::vfloat_impl<16>_&,_false> _Stack_a968;
  undefined1 auStack_a960 [32];
  RTCFilterFunctionNArguments local_a930;
  undefined1 local_a900 [64];
  undefined8 local_a8a0;
  undefined8 uStack_a898;
  undefined8 local_a890;
  undefined8 uStack_a888;
  undefined8 local_a880;
  undefined8 uStack_a878;
  undefined8 uStack_a870;
  undefined8 uStack_a868;
  undefined8 uStack_a860;
  undefined8 uStack_a858;
  undefined8 uStack_a850;
  undefined8 uStack_a848;
  undefined8 local_a840;
  undefined8 uStack_a838;
  undefined8 uStack_a830;
  undefined8 uStack_a828;
  undefined8 uStack_a820;
  undefined8 uStack_a818;
  undefined8 uStack_a810;
  undefined8 uStack_a808;
  undefined8 local_a800;
  undefined8 uStack_a7f8;
  undefined8 uStack_a7f0;
  undefined8 uStack_a7e8;
  undefined8 uStack_a7e0;
  undefined8 uStack_a7d8;
  undefined8 uStack_a7d0;
  undefined8 uStack_a7c8;
  undefined1 local_a7c0 [64];
  anon_union_192_2_4062524c_for_Vec3<embree::vfloat_impl<16>_>_1 local_a780;
  undefined1 local_a6c0 [64];
  undefined1 local_a680 [64];
  undefined1 local_a640 [64];
  undefined1 local_a600 [64];
  undefined1 local_a5c0 [64];
  undefined1 local_a580 [64];
  undefined1 local_a540 [64];
  undefined1 local_a500 [64];
  undefined1 local_a4c0 [64];
  undefined1 local_a480 [64];
  undefined1 local_a440 [64];
  undefined1 local_a400 [64];
  undefined1 local_a3c0 [64];
  anon_union_192_2_4062524c_for_Vec3<embree::vfloat_impl<16>_>_1 local_a380;
  undefined1 local_a2c0 [64];
  undefined1 local_a280 [64];
  undefined1 local_a240 [64];
  undefined1 local_a200 [64];
  undefined1 local_a1c0 [64];
  undefined1 local_a180 [64];
  undefined1 local_a140 [64];
  undefined1 local_a100 [64];
  undefined1 local_a0c0 [64];
  undefined1 local_a080 [64];
  undefined1 local_a040 [64];
  undefined1 local_a000 [64];
  uint local_9fc0;
  uint uStack_9fbc;
  uint uStack_9fb8;
  uint uStack_9fb4;
  uint uStack_9fb0;
  uint uStack_9fac;
  uint uStack_9fa8;
  uint uStack_9fa4;
  uint uStack_9fa0;
  uint uStack_9f9c;
  uint uStack_9f98;
  uint uStack_9f94;
  uint uStack_9f90;
  uint uStack_9f8c;
  uint uStack_9f88;
  uint uStack_9f84;
  undefined1 local_9f80 [64];
  undefined1 local_9f40 [64];
  undefined1 local_9f00 [64];
  undefined1 local_9ec0 [112];
  undefined8 local_9e50;
  size_t local_9e48;
  ulong local_9e40 [560];
  undefined1 local_8cc0 [64];
  uint local_8c80;
  uint uStack_8c7c;
  uint uStack_8c78;
  uint uStack_8c74;
  uint uStack_8c70;
  uint uStack_8c6c;
  uint uStack_8c68;
  uint uStack_8c64;
  uint uStack_8c60;
  uint uStack_8c5c;
  uint uStack_8c58;
  uint uStack_8c54;
  uint uStack_8c50;
  uint uStack_8c4c;
  uint uStack_8c48;
  uint uStack_8c44;
  undefined1 local_8c40 [35856];
  
  local_a998 = (BVH *)This->ptr;
  local_9e48 = (local_a998->root).ptr;
  if (local_9e48 != 8) {
    auVar72 = vpternlogd_avx512f(in_ZMM2,in_ZMM2,in_ZMM2,0xff);
    auVar112 = ZEXT1664(ZEXT816(0) << 0x40);
    uVar68 = vcmpps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar112,5);
    uVar58 = vpcmpeqd_avx512f(auVar72,(undefined1  [64])valid_i->field_0);
    uVar68 = uVar68 & uVar58;
    if ((ushort)uVar68 != 0) {
      local_a380.field_0.x.field_0 =
           (vfloat_impl<16>)(vfloat_impl<16>)*(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)ray;
      local_a380.field_0.y.field_0 =
           (vfloat_impl<16>)
           (vfloat_impl<16>)*(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)(ray + 0x40);
      local_a380.field_0.z.field_0 =
           (vfloat_impl<16>)
           (vfloat_impl<16>)*(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)(ray + 0x80);
      local_a2c0 = *(undefined1 (*) [64])(ray + 0x100);
      local_a280 = *(undefined1 (*) [64])(ray + 0x140);
      local_a240 = *(undefined1 (*) [64])(ray + 0x180);
      auVar72 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
      auVar73 = vandps_avx512dq(local_a2c0,auVar72);
      auVar74 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
      uVar58 = vcmpps_avx512f(auVar73,auVar74,1);
      bVar57 = (bool)((byte)uVar58 & 1);
      iVar70 = auVar74._0_4_;
      auVar73._0_4_ = (uint)bVar57 * iVar70 | (uint)!bVar57 * local_a2c0._0_4_;
      bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
      iVar96 = auVar74._4_4_;
      auVar73._4_4_ = (uint)bVar57 * iVar96 | (uint)!bVar57 * local_a2c0._4_4_;
      bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
      iVar97 = auVar74._8_4_;
      auVar73._8_4_ = (uint)bVar57 * iVar97 | (uint)!bVar57 * local_a2c0._8_4_;
      bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
      iVar98 = auVar74._12_4_;
      auVar73._12_4_ = (uint)bVar57 * iVar98 | (uint)!bVar57 * local_a2c0._12_4_;
      bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
      iVar99 = auVar74._16_4_;
      auVar73._16_4_ = (uint)bVar57 * iVar99 | (uint)!bVar57 * local_a2c0._16_4_;
      bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
      iVar100 = auVar74._20_4_;
      auVar73._20_4_ = (uint)bVar57 * iVar100 | (uint)!bVar57 * local_a2c0._20_4_;
      bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
      iVar101 = auVar74._24_4_;
      auVar73._24_4_ = (uint)bVar57 * iVar101 | (uint)!bVar57 * local_a2c0._24_4_;
      bVar57 = (bool)((byte)(uVar58 >> 7) & 1);
      iVar102 = auVar74._28_4_;
      auVar73._28_4_ = (uint)bVar57 * iVar102 | (uint)!bVar57 * local_a2c0._28_4_;
      bVar57 = (bool)((byte)(uVar58 >> 8) & 1);
      iVar103 = auVar74._32_4_;
      auVar73._32_4_ = (uint)bVar57 * iVar103 | (uint)!bVar57 * local_a2c0._32_4_;
      bVar57 = (bool)((byte)(uVar58 >> 9) & 1);
      iVar104 = auVar74._36_4_;
      auVar73._36_4_ = (uint)bVar57 * iVar104 | (uint)!bVar57 * local_a2c0._36_4_;
      bVar57 = (bool)((byte)(uVar58 >> 10) & 1);
      iVar105 = auVar74._40_4_;
      auVar73._40_4_ = (uint)bVar57 * iVar105 | (uint)!bVar57 * local_a2c0._40_4_;
      bVar57 = (bool)((byte)(uVar58 >> 0xb) & 1);
      iVar106 = auVar74._44_4_;
      auVar73._44_4_ = (uint)bVar57 * iVar106 | (uint)!bVar57 * local_a2c0._44_4_;
      bVar57 = (bool)((byte)(uVar58 >> 0xc) & 1);
      iVar107 = auVar74._48_4_;
      auVar73._48_4_ = (uint)bVar57 * iVar107 | (uint)!bVar57 * local_a2c0._48_4_;
      bVar57 = (bool)((byte)(uVar58 >> 0xd) & 1);
      iVar108 = auVar74._52_4_;
      auVar73._52_4_ = (uint)bVar57 * iVar108 | (uint)!bVar57 * local_a2c0._52_4_;
      bVar57 = (bool)((byte)(uVar58 >> 0xe) & 1);
      iVar109 = auVar74._56_4_;
      iVar110 = auVar74._60_4_;
      auVar73._56_4_ = (uint)bVar57 * iVar109 | (uint)!bVar57 * local_a2c0._56_4_;
      bVar57 = SUB81(uVar58 >> 0xf,0);
      auVar73._60_4_ = (uint)bVar57 * iVar110 | (uint)!bVar57 * local_a2c0._60_4_;
      auVar75 = vandps_avx512dq(local_a280,auVar72);
      uVar58 = vcmpps_avx512f(auVar75,auVar74,1);
      bVar57 = (bool)((byte)uVar58 & 1);
      auVar75._0_4_ = (uint)bVar57 * iVar70 | (uint)!bVar57 * local_a280._0_4_;
      bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar75._4_4_ = (uint)bVar57 * iVar96 | (uint)!bVar57 * local_a280._4_4_;
      bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar75._8_4_ = (uint)bVar57 * iVar97 | (uint)!bVar57 * local_a280._8_4_;
      bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar75._12_4_ = (uint)bVar57 * iVar98 | (uint)!bVar57 * local_a280._12_4_;
      bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar75._16_4_ = (uint)bVar57 * iVar99 | (uint)!bVar57 * local_a280._16_4_;
      bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar75._20_4_ = (uint)bVar57 * iVar100 | (uint)!bVar57 * local_a280._20_4_;
      bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar75._24_4_ = (uint)bVar57 * iVar101 | (uint)!bVar57 * local_a280._24_4_;
      bVar57 = (bool)((byte)(uVar58 >> 7) & 1);
      auVar75._28_4_ = (uint)bVar57 * iVar102 | (uint)!bVar57 * local_a280._28_4_;
      bVar57 = (bool)((byte)(uVar58 >> 8) & 1);
      auVar75._32_4_ = (uint)bVar57 * iVar103 | (uint)!bVar57 * local_a280._32_4_;
      bVar57 = (bool)((byte)(uVar58 >> 9) & 1);
      auVar75._36_4_ = (uint)bVar57 * iVar104 | (uint)!bVar57 * local_a280._36_4_;
      bVar57 = (bool)((byte)(uVar58 >> 10) & 1);
      auVar75._40_4_ = (uint)bVar57 * iVar105 | (uint)!bVar57 * local_a280._40_4_;
      bVar57 = (bool)((byte)(uVar58 >> 0xb) & 1);
      auVar75._44_4_ = (uint)bVar57 * iVar106 | (uint)!bVar57 * local_a280._44_4_;
      bVar57 = (bool)((byte)(uVar58 >> 0xc) & 1);
      auVar75._48_4_ = (uint)bVar57 * iVar107 | (uint)!bVar57 * local_a280._48_4_;
      bVar57 = (bool)((byte)(uVar58 >> 0xd) & 1);
      auVar75._52_4_ = (uint)bVar57 * iVar108 | (uint)!bVar57 * local_a280._52_4_;
      bVar57 = (bool)((byte)(uVar58 >> 0xe) & 1);
      auVar75._56_4_ = (uint)bVar57 * iVar109 | (uint)!bVar57 * local_a280._56_4_;
      bVar57 = SUB81(uVar58 >> 0xf,0);
      auVar75._60_4_ = (uint)bVar57 * iVar110 | (uint)!bVar57 * local_a280._60_4_;
      auVar72 = vandps_avx512dq(local_a240,auVar72);
      uVar58 = vcmpps_avx512f(auVar72,auVar74,1);
      auVar72 = vrcp14ps_avx512f(auVar73);
      bVar57 = (bool)((byte)uVar58 & 1);
      auVar74._0_4_ = (uint)bVar57 * iVar70 | (uint)!bVar57 * local_a240._0_4_;
      bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar74._4_4_ = (uint)bVar57 * iVar96 | (uint)!bVar57 * local_a240._4_4_;
      bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar74._8_4_ = (uint)bVar57 * iVar97 | (uint)!bVar57 * local_a240._8_4_;
      bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar74._12_4_ = (uint)bVar57 * iVar98 | (uint)!bVar57 * local_a240._12_4_;
      bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar74._16_4_ = (uint)bVar57 * iVar99 | (uint)!bVar57 * local_a240._16_4_;
      bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar74._20_4_ = (uint)bVar57 * iVar100 | (uint)!bVar57 * local_a240._20_4_;
      bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar74._24_4_ = (uint)bVar57 * iVar101 | (uint)!bVar57 * local_a240._24_4_;
      bVar57 = (bool)((byte)(uVar58 >> 7) & 1);
      auVar74._28_4_ = (uint)bVar57 * iVar102 | (uint)!bVar57 * local_a240._28_4_;
      bVar57 = (bool)((byte)(uVar58 >> 8) & 1);
      auVar74._32_4_ = (uint)bVar57 * iVar103 | (uint)!bVar57 * local_a240._32_4_;
      bVar57 = (bool)((byte)(uVar58 >> 9) & 1);
      auVar74._36_4_ = (uint)bVar57 * iVar104 | (uint)!bVar57 * local_a240._36_4_;
      bVar57 = (bool)((byte)(uVar58 >> 10) & 1);
      auVar74._40_4_ = (uint)bVar57 * iVar105 | (uint)!bVar57 * local_a240._40_4_;
      bVar57 = (bool)((byte)(uVar58 >> 0xb) & 1);
      auVar74._44_4_ = (uint)bVar57 * iVar106 | (uint)!bVar57 * local_a240._44_4_;
      bVar57 = (bool)((byte)(uVar58 >> 0xc) & 1);
      auVar74._48_4_ = (uint)bVar57 * iVar107 | (uint)!bVar57 * local_a240._48_4_;
      bVar57 = (bool)((byte)(uVar58 >> 0xd) & 1);
      auVar74._52_4_ = (uint)bVar57 * iVar108 | (uint)!bVar57 * local_a240._52_4_;
      bVar57 = (bool)((byte)(uVar58 >> 0xe) & 1);
      auVar74._56_4_ = (uint)bVar57 * iVar109 | (uint)!bVar57 * local_a240._56_4_;
      bVar57 = SUB81(uVar58 >> 0xf,0);
      auVar74._60_4_ = (uint)bVar57 * iVar110 | (uint)!bVar57 * local_a240._60_4_;
      auVar76 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar77 = vrcp14ps_avx512f(auVar75);
      auVar73 = vfnmadd213ps_avx512f(auVar73,auVar72,auVar76);
      local_a200 = vfmadd132ps_avx512f(auVar73,auVar72,auVar72);
      auVar72 = vfnmadd213ps_avx512f(auVar75,auVar77,auVar76);
      auVar73 = vrcp14ps_avx512f(auVar74);
      local_a1c0 = vfmadd132ps_avx512f(auVar72,auVar77,auVar77);
      auVar72 = vfnmadd213ps_avx512f(auVar74,auVar73,auVar76);
      local_a180 = vfmadd132ps_avx512f(auVar72,auVar73,auVar73);
      local_a140 = vmulps_avx512f((undefined1  [64])
                                  *(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)ray,local_a200)
      ;
      local_a100 = vmulps_avx512f((undefined1  [64])
                                  *(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)(ray + 0x40),
                                  local_a1c0);
      local_a0c0 = vmulps_avx512f((undefined1  [64])
                                  *(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)(ray + 0x80),
                                  local_a180);
      uVar58 = vcmpps_avx512f(local_a200,auVar112,1);
      auVar72 = vpbroadcastd_avx512f(ZEXT416(0x20));
      auVar77._4_4_ = (uint)((byte)(uVar58 >> 1) & 1) * auVar72._4_4_;
      auVar77._0_4_ = (uint)((byte)uVar58 & 1) * auVar72._0_4_;
      auVar77._8_4_ = (uint)((byte)(uVar58 >> 2) & 1) * auVar72._8_4_;
      auVar77._12_4_ = (uint)((byte)(uVar58 >> 3) & 1) * auVar72._12_4_;
      auVar77._16_4_ = (uint)((byte)(uVar58 >> 4) & 1) * auVar72._16_4_;
      auVar77._20_4_ = (uint)((byte)(uVar58 >> 5) & 1) * auVar72._20_4_;
      auVar77._24_4_ = (uint)((byte)(uVar58 >> 6) & 1) * auVar72._24_4_;
      auVar77._28_4_ = (uint)((byte)(uVar58 >> 7) & 1) * auVar72._28_4_;
      auVar77._32_4_ = (uint)((byte)(uVar58 >> 8) & 1) * auVar72._32_4_;
      auVar77._36_4_ = (uint)((byte)(uVar58 >> 9) & 1) * auVar72._36_4_;
      auVar77._40_4_ = (uint)((byte)(uVar58 >> 10) & 1) * auVar72._40_4_;
      auVar77._44_4_ = (uint)((byte)(uVar58 >> 0xb) & 1) * auVar72._44_4_;
      auVar77._48_4_ = (uint)((byte)(uVar58 >> 0xc) & 1) * auVar72._48_4_;
      auVar77._52_4_ = (uint)((byte)(uVar58 >> 0xd) & 1) * auVar72._52_4_;
      auVar77._56_4_ = (uint)((byte)(uVar58 >> 0xe) & 1) * auVar72._56_4_;
      auVar77._60_4_ = (uint)(byte)(uVar58 >> 0xf) * auVar72._60_4_;
      local_a080 = vmovdqa64_avx512f(auVar77);
      uVar58 = vcmpps_avx512f(local_a1c0,auVar112,5);
      auVar72 = vpbroadcastd_avx512f(ZEXT416(0x60));
      auVar73 = vpbroadcastd_avx512f(ZEXT416(0x40));
      bVar57 = (bool)((byte)uVar58 & 1);
      auVar78._0_4_ = (uint)bVar57 * auVar73._0_4_ | (uint)!bVar57 * auVar72._0_4_;
      bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar78._4_4_ = (uint)bVar57 * auVar73._4_4_ | (uint)!bVar57 * auVar72._4_4_;
      bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar78._8_4_ = (uint)bVar57 * auVar73._8_4_ | (uint)!bVar57 * auVar72._8_4_;
      bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar78._12_4_ = (uint)bVar57 * auVar73._12_4_ | (uint)!bVar57 * auVar72._12_4_;
      bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar78._16_4_ = (uint)bVar57 * auVar73._16_4_ | (uint)!bVar57 * auVar72._16_4_;
      bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar78._20_4_ = (uint)bVar57 * auVar73._20_4_ | (uint)!bVar57 * auVar72._20_4_;
      bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar78._24_4_ = (uint)bVar57 * auVar73._24_4_ | (uint)!bVar57 * auVar72._24_4_;
      bVar57 = (bool)((byte)(uVar58 >> 7) & 1);
      auVar78._28_4_ = (uint)bVar57 * auVar73._28_4_ | (uint)!bVar57 * auVar72._28_4_;
      bVar57 = (bool)((byte)(uVar58 >> 8) & 1);
      auVar78._32_4_ = (uint)bVar57 * auVar73._32_4_ | (uint)!bVar57 * auVar72._32_4_;
      bVar57 = (bool)((byte)(uVar58 >> 9) & 1);
      auVar78._36_4_ = (uint)bVar57 * auVar73._36_4_ | (uint)!bVar57 * auVar72._36_4_;
      bVar57 = (bool)((byte)(uVar58 >> 10) & 1);
      auVar78._40_4_ = (uint)bVar57 * auVar73._40_4_ | (uint)!bVar57 * auVar72._40_4_;
      bVar57 = (bool)((byte)(uVar58 >> 0xb) & 1);
      auVar78._44_4_ = (uint)bVar57 * auVar73._44_4_ | (uint)!bVar57 * auVar72._44_4_;
      bVar57 = (bool)((byte)(uVar58 >> 0xc) & 1);
      auVar78._48_4_ = (uint)bVar57 * auVar73._48_4_ | (uint)!bVar57 * auVar72._48_4_;
      bVar57 = (bool)((byte)(uVar58 >> 0xd) & 1);
      auVar78._52_4_ = (uint)bVar57 * auVar73._52_4_ | (uint)!bVar57 * auVar72._52_4_;
      bVar57 = (bool)((byte)(uVar58 >> 0xe) & 1);
      auVar78._56_4_ = (uint)bVar57 * auVar73._56_4_ | (uint)!bVar57 * auVar72._56_4_;
      bVar57 = SUB81(uVar58 >> 0xf,0);
      auVar78._60_4_ = (uint)bVar57 * auVar73._60_4_ | (uint)!bVar57 * auVar72._60_4_;
      local_a040 = vmovdqa64_avx512f(auVar78);
      uVar58 = vcmpps_avx512f(local_a180,auVar112,5);
      auVar72 = vpbroadcastd_avx512f(ZEXT416(0xa0));
      auVar73 = vpbroadcastd_avx512f(ZEXT416(0x80));
      bVar57 = (bool)((byte)uVar58 & 1);
      auVar79._0_4_ = (uint)bVar57 * auVar73._0_4_ | (uint)!bVar57 * auVar72._0_4_;
      bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar79._4_4_ = (uint)bVar57 * auVar73._4_4_ | (uint)!bVar57 * auVar72._4_4_;
      bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar79._8_4_ = (uint)bVar57 * auVar73._8_4_ | (uint)!bVar57 * auVar72._8_4_;
      bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar79._12_4_ = (uint)bVar57 * auVar73._12_4_ | (uint)!bVar57 * auVar72._12_4_;
      bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar79._16_4_ = (uint)bVar57 * auVar73._16_4_ | (uint)!bVar57 * auVar72._16_4_;
      bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar79._20_4_ = (uint)bVar57 * auVar73._20_4_ | (uint)!bVar57 * auVar72._20_4_;
      bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar79._24_4_ = (uint)bVar57 * auVar73._24_4_ | (uint)!bVar57 * auVar72._24_4_;
      bVar57 = (bool)((byte)(uVar58 >> 7) & 1);
      auVar79._28_4_ = (uint)bVar57 * auVar73._28_4_ | (uint)!bVar57 * auVar72._28_4_;
      bVar57 = (bool)((byte)(uVar58 >> 8) & 1);
      auVar79._32_4_ = (uint)bVar57 * auVar73._32_4_ | (uint)!bVar57 * auVar72._32_4_;
      bVar57 = (bool)((byte)(uVar58 >> 9) & 1);
      auVar79._36_4_ = (uint)bVar57 * auVar73._36_4_ | (uint)!bVar57 * auVar72._36_4_;
      bVar57 = (bool)((byte)(uVar58 >> 10) & 1);
      auVar79._40_4_ = (uint)bVar57 * auVar73._40_4_ | (uint)!bVar57 * auVar72._40_4_;
      bVar57 = (bool)((byte)(uVar58 >> 0xb) & 1);
      auVar79._44_4_ = (uint)bVar57 * auVar73._44_4_ | (uint)!bVar57 * auVar72._44_4_;
      bVar57 = (bool)((byte)(uVar58 >> 0xc) & 1);
      auVar79._48_4_ = (uint)bVar57 * auVar73._48_4_ | (uint)!bVar57 * auVar72._48_4_;
      bVar57 = (bool)((byte)(uVar58 >> 0xd) & 1);
      auVar79._52_4_ = (uint)bVar57 * auVar73._52_4_ | (uint)!bVar57 * auVar72._52_4_;
      bVar57 = (bool)((byte)(uVar58 >> 0xe) & 1);
      auVar79._56_4_ = (uint)bVar57 * auVar73._56_4_ | (uint)!bVar57 * auVar72._56_4_;
      bVar57 = SUB81(uVar58 >> 0xf,0);
      auVar79._60_4_ = (uint)bVar57 * auVar73._60_4_ | (uint)!bVar57 * auVar72._60_4_;
      local_a000 = vmovdqa64_avx512f(auVar79);
      auVar72 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
      local_a9a8 = (uint)uVar68;
      auVar73 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0xc0),auVar112);
      bVar57 = (bool)((byte)uVar68 & 1);
      local_9fc0 = (uint)bVar57 * auVar73._0_4_ | (uint)!bVar57 * auVar72._0_4_;
      bVar57 = (bool)((byte)(uVar68 >> 1) & 1);
      uStack_9fbc = (uint)bVar57 * auVar73._4_4_ | (uint)!bVar57 * auVar72._4_4_;
      bVar57 = (bool)((byte)(uVar68 >> 2) & 1);
      uStack_9fb8 = (uint)bVar57 * auVar73._8_4_ | (uint)!bVar57 * auVar72._8_4_;
      bVar57 = (bool)((byte)(uVar68 >> 3) & 1);
      uStack_9fb4 = (uint)bVar57 * auVar73._12_4_ | (uint)!bVar57 * auVar72._12_4_;
      bVar57 = (bool)((byte)(uVar68 >> 4) & 1);
      uStack_9fb0 = (uint)bVar57 * auVar73._16_4_ | (uint)!bVar57 * auVar72._16_4_;
      bVar57 = (bool)((byte)(uVar68 >> 5) & 1);
      uStack_9fac = (uint)bVar57 * auVar73._20_4_ | (uint)!bVar57 * auVar72._20_4_;
      bVar57 = (bool)((byte)(uVar68 >> 6) & 1);
      uStack_9fa8 = (uint)bVar57 * auVar73._24_4_ | (uint)!bVar57 * auVar72._24_4_;
      bVar57 = (bool)((byte)(uVar68 >> 7) & 1);
      uStack_9fa4 = (uint)bVar57 * auVar73._28_4_ | (uint)!bVar57 * auVar72._28_4_;
      bVar13 = (byte)(uVar68 >> 8);
      bVar57 = (bool)(bVar13 & 1);
      uStack_9fa0 = (uint)bVar57 * auVar73._32_4_ | (uint)!bVar57 * auVar72._32_4_;
      bVar57 = (bool)((byte)(uVar68 >> 9) & 1);
      uStack_9f9c = (uint)bVar57 * auVar73._36_4_ | (uint)!bVar57 * auVar72._36_4_;
      bVar57 = (bool)((byte)(uVar68 >> 10) & 1);
      uStack_9f98 = (uint)bVar57 * auVar73._40_4_ | (uint)!bVar57 * auVar72._40_4_;
      bVar57 = (bool)((byte)(uVar68 >> 0xb) & 1);
      uStack_9f94 = (uint)bVar57 * auVar73._44_4_ | (uint)!bVar57 * auVar72._44_4_;
      bVar57 = (bool)((byte)(uVar68 >> 0xc) & 1);
      uStack_9f90 = (uint)bVar57 * auVar73._48_4_ | (uint)!bVar57 * auVar72._48_4_;
      bVar57 = (bool)((byte)(uVar68 >> 0xd) & 1);
      uStack_9f8c = (uint)bVar57 * auVar73._52_4_ | (uint)!bVar57 * auVar72._52_4_;
      bVar57 = (bool)((byte)(uVar68 >> 0xe) & 1);
      uStack_9f88 = (uint)bVar57 * auVar73._56_4_ | (uint)!bVar57 * auVar72._56_4_;
      bVar57 = SUB81(uVar68 >> 0xf,0);
      uStack_9f84 = (uint)bVar57 * auVar73._60_4_ | (uint)!bVar57 * auVar72._60_4_;
      auVar73 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      auVar112 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar112);
      bVar57 = (bool)((byte)uVar68 & 1);
      bVar6 = (bool)((byte)(uVar68 >> 1) & 1);
      bVar7 = (bool)((byte)(uVar68 >> 2) & 1);
      bVar8 = (bool)((byte)(uVar68 >> 3) & 1);
      bVar9 = (bool)((byte)(uVar68 >> 4) & 1);
      bVar10 = (bool)((byte)(uVar68 >> 5) & 1);
      bVar11 = (bool)((byte)(uVar68 >> 6) & 1);
      bVar12 = (bool)((byte)(uVar68 >> 7) & 1);
      bVar14 = (bool)(bVar13 & 1);
      bVar15 = (bool)((byte)(uVar68 >> 9) & 1);
      bVar16 = (bool)((byte)(uVar68 >> 10) & 1);
      bVar17 = (bool)((byte)(uVar68 >> 0xb) & 1);
      bVar18 = (bool)((byte)(uVar68 >> 0xc) & 1);
      bVar19 = (bool)((byte)(uVar68 >> 0xd) & 1);
      bVar20 = (bool)((byte)(uVar68 >> 0xe) & 1);
      bVar21 = SUB81(uVar68 >> 0xf,0);
      local_9f80._4_4_ = (uint)bVar6 * auVar112._4_4_ | (uint)!bVar6 * auVar73._4_4_;
      local_9f80._0_4_ = (uint)bVar57 * auVar112._0_4_ | (uint)!bVar57 * auVar73._0_4_;
      local_9f80._8_4_ = (uint)bVar7 * auVar112._8_4_ | (uint)!bVar7 * auVar73._8_4_;
      local_9f80._12_4_ = (uint)bVar8 * auVar112._12_4_ | (uint)!bVar8 * auVar73._12_4_;
      local_9f80._16_4_ = (uint)bVar9 * auVar112._16_4_ | (uint)!bVar9 * auVar73._16_4_;
      local_9f80._20_4_ = (uint)bVar10 * auVar112._20_4_ | (uint)!bVar10 * auVar73._20_4_;
      local_9f80._24_4_ = (uint)bVar11 * auVar112._24_4_ | (uint)!bVar11 * auVar73._24_4_;
      local_9f80._28_4_ = (uint)bVar12 * auVar112._28_4_ | (uint)!bVar12 * auVar73._28_4_;
      local_9f80._32_4_ = (uint)bVar14 * auVar112._32_4_ | (uint)!bVar14 * auVar73._32_4_;
      local_9f80._36_4_ = (uint)bVar15 * auVar112._36_4_ | (uint)!bVar15 * auVar73._36_4_;
      local_9f80._40_4_ = (uint)bVar16 * auVar112._40_4_ | (uint)!bVar16 * auVar73._40_4_;
      local_9f80._44_4_ = (uint)bVar17 * auVar112._44_4_ | (uint)!bVar17 * auVar73._44_4_;
      local_9f80._48_4_ = (uint)bVar18 * auVar112._48_4_ | (uint)!bVar18 * auVar73._48_4_;
      local_9f80._52_4_ = (uint)bVar19 * auVar112._52_4_ | (uint)!bVar19 * auVar73._52_4_;
      local_9f80._56_4_ = (uint)bVar20 * auVar112._56_4_ | (uint)!bVar20 * auVar73._56_4_;
      local_9f80._60_4_ = (uint)bVar21 * auVar112._60_4_ | (uint)!bVar21 * auVar73._60_4_;
      local_a9f8 = (uint)(ushort)~(ushort)uVar68;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar68 = 0xe;
      }
      else {
        uVar68 = 2;
        if ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT) {
          uVar68 = 0xe;
        }
      }
      local_a9a0 = ray + 0x200;
      puVar67 = local_9e40;
      local_9e50 = 0xfffffffffffffff8;
      pauVar63 = (undefined1 (*) [64])local_8c40;
      local_8c80 = local_9fc0;
      uStack_8c7c = uStack_9fbc;
      uStack_8c78 = uStack_9fb8;
      uStack_8c74 = uStack_9fb4;
      uStack_8c70 = uStack_9fb0;
      uStack_8c6c = uStack_9fac;
      uStack_8c68 = uStack_9fa8;
      uStack_8c64 = uStack_9fa4;
      uStack_8c60 = uStack_9fa0;
      uStack_8c5c = uStack_9f9c;
      uStack_8c58 = uStack_9f98;
      uStack_8c54 = uStack_9f94;
      uStack_8c50 = uStack_9f90;
      uStack_8c4c = uStack_9f8c;
      uStack_8c48 = uStack_9f88;
      uStack_8c44 = uStack_9f84;
      auVar71 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
      auVar73 = ZEXT1664(auVar71);
      auVar112 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
      local_a9d8 = context;
      local_a990 = This;
      local_8cc0 = auVar72;
LAB_01e3d363:
      do {
        do {
          root.ptr = puVar67[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01e3e296;
          puVar67 = puVar67 + -1;
          pauVar63 = pauVar63 + -1;
          auVar74 = *pauVar63;
          uVar58 = vcmpps_avx512f(auVar74,local_9f80,1);
        } while ((short)uVar58 == 0);
        local_a9d0 = (Geometry *)(ulong)(uint)POPCOUNT((int)uVar58);
        if (uVar68 < local_a9d0) {
LAB_01e3d3a5:
          do {
            lVar61 = -0x20;
            uVar60 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01e3e296;
              uVar23 = vcmpps_avx512f(auVar74,local_9f80,9);
              if ((short)uVar23 == 0) goto LAB_01e3d363;
              local_a988 = (ulong)(uVar60 & 0xf) - 8;
              local_a9e0 = ~local_a9f8;
              lVar61 = 0;
              goto LAB_01e3d5eb;
            }
            uVar58 = root.ptr & 0xfffffffffffffff0;
            root.ptr = 8;
            auVar75 = auVar72;
            for (; (lVar61 != 0 && (uVar65 = *(ulong *)(uVar58 + 0x40 + lVar61 * 2), uVar65 != 8));
                lVar61 = lVar61 + 4) {
              auVar78 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar58 + 0x120 + lVar61)));
              auVar77 = *(undefined1 (*) [64])(ray + 0x1c0);
              uVar1 = *(undefined4 *)(uVar58 + 0x60 + lVar61);
              auVar25._4_4_ = uVar1;
              auVar25._0_4_ = uVar1;
              auVar25._8_4_ = uVar1;
              auVar25._12_4_ = uVar1;
              auVar25._16_4_ = uVar1;
              auVar25._20_4_ = uVar1;
              auVar25._24_4_ = uVar1;
              auVar25._28_4_ = uVar1;
              auVar25._32_4_ = uVar1;
              auVar25._36_4_ = uVar1;
              auVar25._40_4_ = uVar1;
              auVar25._44_4_ = uVar1;
              auVar25._48_4_ = uVar1;
              auVar25._52_4_ = uVar1;
              auVar25._56_4_ = uVar1;
              auVar25._60_4_ = uVar1;
              auVar78 = vfmadd213ps_avx512f(auVar78,auVar77,auVar25);
              auVar79 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar58 + 0x160 + lVar61)));
              uVar1 = *(undefined4 *)(uVar58 + 0xa0 + lVar61);
              auVar26._4_4_ = uVar1;
              auVar26._0_4_ = uVar1;
              auVar26._8_4_ = uVar1;
              auVar26._12_4_ = uVar1;
              auVar26._16_4_ = uVar1;
              auVar26._20_4_ = uVar1;
              auVar26._24_4_ = uVar1;
              auVar26._28_4_ = uVar1;
              auVar26._32_4_ = uVar1;
              auVar26._36_4_ = uVar1;
              auVar26._40_4_ = uVar1;
              auVar26._44_4_ = uVar1;
              auVar26._48_4_ = uVar1;
              auVar26._52_4_ = uVar1;
              auVar26._56_4_ = uVar1;
              auVar26._60_4_ = uVar1;
              auVar79 = vfmadd213ps_avx512f(auVar79,auVar77,auVar26);
              auVar80 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar58 + 0x1a0 + lVar61)));
              uVar1 = *(undefined4 *)(uVar58 + 0xe0 + lVar61);
              auVar27._4_4_ = uVar1;
              auVar27._0_4_ = uVar1;
              auVar27._8_4_ = uVar1;
              auVar27._12_4_ = uVar1;
              auVar27._16_4_ = uVar1;
              auVar27._20_4_ = uVar1;
              auVar27._24_4_ = uVar1;
              auVar27._28_4_ = uVar1;
              auVar27._32_4_ = uVar1;
              auVar27._36_4_ = uVar1;
              auVar27._40_4_ = uVar1;
              auVar27._44_4_ = uVar1;
              auVar27._48_4_ = uVar1;
              auVar27._52_4_ = uVar1;
              auVar27._56_4_ = uVar1;
              auVar27._60_4_ = uVar1;
              auVar80 = vfmadd213ps_avx512f(auVar80,auVar77,auVar27);
              auVar81 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar58 + 0x140 + lVar61)));
              uVar1 = *(undefined4 *)(uVar58 + 0x80 + lVar61);
              auVar28._4_4_ = uVar1;
              auVar28._0_4_ = uVar1;
              auVar28._8_4_ = uVar1;
              auVar28._12_4_ = uVar1;
              auVar28._16_4_ = uVar1;
              auVar28._20_4_ = uVar1;
              auVar28._24_4_ = uVar1;
              auVar28._28_4_ = uVar1;
              auVar28._32_4_ = uVar1;
              auVar28._36_4_ = uVar1;
              auVar28._40_4_ = uVar1;
              auVar28._44_4_ = uVar1;
              auVar28._48_4_ = uVar1;
              auVar28._52_4_ = uVar1;
              auVar28._56_4_ = uVar1;
              auVar28._60_4_ = uVar1;
              auVar81 = vfmadd213ps_avx512f(auVar81,auVar77,auVar28);
              auVar82 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar58 + 0x180 + lVar61)));
              uVar1 = *(undefined4 *)(uVar58 + 0xc0 + lVar61);
              auVar29._4_4_ = uVar1;
              auVar29._0_4_ = uVar1;
              auVar29._8_4_ = uVar1;
              auVar29._12_4_ = uVar1;
              auVar29._16_4_ = uVar1;
              auVar29._20_4_ = uVar1;
              auVar29._24_4_ = uVar1;
              auVar29._28_4_ = uVar1;
              auVar29._32_4_ = uVar1;
              auVar29._36_4_ = uVar1;
              auVar29._40_4_ = uVar1;
              auVar29._44_4_ = uVar1;
              auVar29._48_4_ = uVar1;
              auVar29._52_4_ = uVar1;
              auVar29._56_4_ = uVar1;
              auVar29._60_4_ = uVar1;
              auVar82 = vfmadd213ps_avx512f(auVar82,auVar77,auVar29);
              auVar83 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar58 + 0x1c0 + lVar61)));
              uVar1 = *(undefined4 *)(uVar58 + 0x100 + lVar61);
              auVar30._4_4_ = uVar1;
              auVar30._0_4_ = uVar1;
              auVar30._8_4_ = uVar1;
              auVar30._12_4_ = uVar1;
              auVar30._16_4_ = uVar1;
              auVar30._20_4_ = uVar1;
              auVar30._24_4_ = uVar1;
              auVar30._28_4_ = uVar1;
              auVar30._32_4_ = uVar1;
              auVar30._36_4_ = uVar1;
              auVar30._40_4_ = uVar1;
              auVar30._44_4_ = uVar1;
              auVar30._48_4_ = uVar1;
              auVar30._52_4_ = uVar1;
              auVar30._56_4_ = uVar1;
              auVar30._60_4_ = uVar1;
              auVar83 = vfmadd213ps_avx512f(auVar83,auVar77,auVar30);
              auVar78 = vfmsub213ps_avx512f(auVar78,local_a200,local_a140);
              auVar79 = vfmsub213ps_avx512f(auVar79,local_a1c0,local_a100);
              auVar80 = vfmsub213ps_avx512f(auVar80,local_a180,local_a0c0);
              auVar81 = vfmsub213ps_avx512f(auVar81,local_a200,local_a140);
              auVar82 = vfmsub213ps_avx512f(auVar82,local_a1c0,local_a100);
              auVar83 = vfmsub213ps_avx512f(auVar83,local_a180,local_a0c0);
              auVar84 = vpminsd_avx512f(auVar78,auVar81);
              auVar85 = vpminsd_avx512f(auVar79,auVar82);
              auVar84 = vpmaxsd_avx512f(auVar84,auVar85);
              auVar85 = vpminsd_avx512f(auVar80,auVar83);
              auVar84 = vpmaxsd_avx512f(auVar84,auVar85);
              auVar78 = vpmaxsd_avx512f(auVar78,auVar81);
              auVar79 = vpmaxsd_avx512f(auVar79,auVar82);
              auVar78 = vpminsd_avx512f(auVar78,auVar79);
              auVar79 = vpmaxsd_avx512f(auVar80,auVar83);
              auVar78 = vpminsd_avx512f(auVar78,auVar79);
              auVar56._4_4_ = uStack_9fbc;
              auVar56._0_4_ = local_9fc0;
              auVar56._8_4_ = uStack_9fb8;
              auVar56._12_4_ = uStack_9fb4;
              auVar56._16_4_ = uStack_9fb0;
              auVar56._20_4_ = uStack_9fac;
              auVar56._24_4_ = uStack_9fa8;
              auVar56._28_4_ = uStack_9fa4;
              auVar56._32_4_ = uStack_9fa0;
              auVar56._36_4_ = uStack_9f9c;
              auVar56._40_4_ = uStack_9f98;
              auVar56._44_4_ = uStack_9f94;
              auVar56._48_4_ = uStack_9f90;
              auVar56._52_4_ = uStack_9f8c;
              auVar56._56_4_ = uStack_9f88;
              auVar56._60_4_ = uStack_9f84;
              auVar79 = vpmaxsd_avx512f(auVar84,auVar56);
              auVar78 = vpminsd_avx512f(auVar78,local_9f80);
              uVar69 = vcmpps_avx512f(auVar79,auVar78,2);
              if ((uVar60 & 7) == 6) {
                uVar1 = *(undefined4 *)(uVar58 + 0x1e0 + lVar61);
                auVar31._4_4_ = uVar1;
                auVar31._0_4_ = uVar1;
                auVar31._8_4_ = uVar1;
                auVar31._12_4_ = uVar1;
                auVar31._16_4_ = uVar1;
                auVar31._20_4_ = uVar1;
                auVar31._24_4_ = uVar1;
                auVar31._28_4_ = uVar1;
                auVar31._32_4_ = uVar1;
                auVar31._36_4_ = uVar1;
                auVar31._40_4_ = uVar1;
                auVar31._44_4_ = uVar1;
                auVar31._48_4_ = uVar1;
                auVar31._52_4_ = uVar1;
                auVar31._56_4_ = uVar1;
                auVar31._60_4_ = uVar1;
                uVar64 = vcmpps_avx512f(auVar77,auVar31,0xd);
                uVar1 = *(undefined4 *)(uVar58 + 0x200 + lVar61);
                auVar32._4_4_ = uVar1;
                auVar32._0_4_ = uVar1;
                auVar32._8_4_ = uVar1;
                auVar32._12_4_ = uVar1;
                auVar32._16_4_ = uVar1;
                auVar32._20_4_ = uVar1;
                auVar32._24_4_ = uVar1;
                auVar32._28_4_ = uVar1;
                auVar32._32_4_ = uVar1;
                auVar32._36_4_ = uVar1;
                auVar32._40_4_ = uVar1;
                auVar32._44_4_ = uVar1;
                auVar32._48_4_ = uVar1;
                auVar32._52_4_ = uVar1;
                auVar32._56_4_ = uVar1;
                auVar32._60_4_ = uVar1;
                uVar22 = vcmpps_avx512f(auVar77,auVar32,1);
                uVar69 = uVar69 & uVar64 & uVar22;
              }
              uVar64 = vcmpps_avx512f(local_9f80,auVar74,6);
              uVar69 = uVar69 & uVar64;
              uVar64 = root.ptr;
              auVar86 = auVar75;
              if ((short)uVar69 != 0) {
                auVar78 = vblendmps_avx512f(auVar72,auVar84);
                bVar57 = (bool)((byte)uVar69 & 1);
                auVar86._0_4_ = (uint)bVar57 * auVar78._0_4_ | (uint)!bVar57 * auVar77._0_4_;
                bVar57 = (bool)((byte)(uVar69 >> 1) & 1);
                auVar86._4_4_ = (uint)bVar57 * auVar78._4_4_ | (uint)!bVar57 * auVar77._4_4_;
                bVar57 = (bool)((byte)(uVar69 >> 2) & 1);
                auVar86._8_4_ = (uint)bVar57 * auVar78._8_4_ | (uint)!bVar57 * auVar77._8_4_;
                bVar57 = (bool)((byte)(uVar69 >> 3) & 1);
                auVar86._12_4_ = (uint)bVar57 * auVar78._12_4_ | (uint)!bVar57 * auVar77._12_4_;
                bVar57 = (bool)((byte)(uVar69 >> 4) & 1);
                auVar86._16_4_ = (uint)bVar57 * auVar78._16_4_ | (uint)!bVar57 * auVar77._16_4_;
                bVar57 = (bool)((byte)(uVar69 >> 5) & 1);
                auVar86._20_4_ = (uint)bVar57 * auVar78._20_4_ | (uint)!bVar57 * auVar77._20_4_;
                bVar57 = (bool)((byte)(uVar69 >> 6) & 1);
                auVar86._24_4_ = (uint)bVar57 * auVar78._24_4_ | (uint)!bVar57 * auVar77._24_4_;
                bVar57 = (bool)((byte)(uVar69 >> 7) & 1);
                auVar86._28_4_ = (uint)bVar57 * auVar78._28_4_ | (uint)!bVar57 * auVar77._28_4_;
                bVar57 = (bool)((byte)(uVar69 >> 8) & 1);
                auVar86._32_4_ = (uint)bVar57 * auVar78._32_4_ | (uint)!bVar57 * auVar77._32_4_;
                bVar57 = (bool)((byte)(uVar69 >> 9) & 1);
                auVar86._36_4_ = (uint)bVar57 * auVar78._36_4_ | (uint)!bVar57 * auVar77._36_4_;
                bVar57 = (bool)((byte)(uVar69 >> 10) & 1);
                auVar86._40_4_ = (uint)bVar57 * auVar78._40_4_ | (uint)!bVar57 * auVar77._40_4_;
                bVar57 = (bool)((byte)(uVar69 >> 0xb) & 1);
                auVar86._44_4_ = (uint)bVar57 * auVar78._44_4_ | (uint)!bVar57 * auVar77._44_4_;
                bVar57 = (bool)((byte)(uVar69 >> 0xc) & 1);
                auVar86._48_4_ = (uint)bVar57 * auVar78._48_4_ | (uint)!bVar57 * auVar77._48_4_;
                bVar57 = (bool)((byte)(uVar69 >> 0xd) & 1);
                auVar86._52_4_ = (uint)bVar57 * auVar78._52_4_ | (uint)!bVar57 * auVar77._52_4_;
                bVar57 = (bool)((byte)(uVar69 >> 0xe) & 1);
                auVar86._56_4_ = (uint)bVar57 * auVar78._56_4_ | (uint)!bVar57 * auVar77._56_4_;
                bVar57 = SUB81(uVar69 >> 0xf,0);
                auVar86._60_4_ = (uint)bVar57 * auVar78._60_4_ | (uint)!bVar57 * auVar77._60_4_;
                uVar64 = uVar65;
                if (root.ptr != 8) {
                  *puVar67 = root.ptr;
                  puVar67 = puVar67 + 1;
                  *pauVar63 = auVar75;
                  pauVar63 = pauVar63 + 1;
                }
              }
              auVar75 = auVar86;
              root.ptr = uVar64;
            }
            if (root.ptr == 8) goto LAB_01e3d594;
            uVar23 = vcmpps_avx512f(auVar75,local_9f80,9);
            auVar74 = auVar75;
          } while ((ushort)uVar68 < (ushort)POPCOUNT((int)uVar23));
          *puVar67 = root.ptr;
          puVar67 = puVar67 + 1;
          *pauVar63 = auVar75;
          pauVar63 = pauVar63 + 1;
LAB_01e3d594:
          iVar70 = 4;
        }
        else {
          local_a900 = auVar74;
          while (auVar71 = auVar73._0_16_, uVar58 != 0) {
            k = 0;
            for (uVar65 = uVar58; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            uVar58 = uVar58 - 1 & uVar58;
            bVar57 = occluded1(local_a990,local_a998,root,k,&local_a9d9,ray,
                               (TravRayK<16,_false> *)&local_a380.field_0,context);
            auVar112 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
            auVar71 = vxorps_avx512vl(auVar71,auVar71);
            auVar73 = ZEXT1664(auVar71);
            auVar72 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
            uVar60 = 1 << ((uint)k & 0x1f);
            if (!bVar57) {
              uVar60 = 0;
            }
            local_a9f8 = local_a9f8 | uVar60;
            context = local_a9d8;
          }
          iVar70 = 3;
          if ((short)local_a9f8 != -1) {
            auVar74 = vbroadcastss_avx512f(ZEXT416(0xff800000));
            bVar57 = (bool)((byte)local_a9f8 & 1);
            local_9f80._0_4_ = (uint)bVar57 * auVar74._0_4_ | (uint)!bVar57 * local_9f80._0_4_;
            bVar57 = (bool)((byte)(local_a9f8 >> 1) & 1);
            local_9f80._4_4_ = (uint)bVar57 * auVar74._4_4_ | (uint)!bVar57 * local_9f80._4_4_;
            bVar57 = (bool)((byte)(local_a9f8 >> 2) & 1);
            local_9f80._8_4_ = (uint)bVar57 * auVar74._8_4_ | (uint)!bVar57 * local_9f80._8_4_;
            bVar57 = (bool)((byte)(local_a9f8 >> 3) & 1);
            local_9f80._12_4_ = (uint)bVar57 * auVar74._12_4_ | (uint)!bVar57 * local_9f80._12_4_;
            bVar57 = (bool)((byte)(local_a9f8 >> 4) & 1);
            local_9f80._16_4_ = (uint)bVar57 * auVar74._16_4_ | (uint)!bVar57 * local_9f80._16_4_;
            bVar57 = (bool)((byte)(local_a9f8 >> 5) & 1);
            local_9f80._20_4_ = (uint)bVar57 * auVar74._20_4_ | (uint)!bVar57 * local_9f80._20_4_;
            bVar57 = (bool)((byte)(local_a9f8 >> 6) & 1);
            local_9f80._24_4_ = (uint)bVar57 * auVar74._24_4_ | (uint)!bVar57 * local_9f80._24_4_;
            bVar57 = (bool)((byte)(local_a9f8 >> 7) & 1);
            local_9f80._28_4_ = (uint)bVar57 * auVar74._28_4_ | (uint)!bVar57 * local_9f80._28_4_;
            bVar57 = (bool)((byte)(local_a9f8 >> 8) & 1);
            local_9f80._32_4_ = (uint)bVar57 * auVar74._32_4_ | (uint)!bVar57 * local_9f80._32_4_;
            bVar57 = (bool)((byte)(local_a9f8 >> 9) & 1);
            local_9f80._36_4_ = (uint)bVar57 * auVar74._36_4_ | (uint)!bVar57 * local_9f80._36_4_;
            bVar57 = (bool)((byte)(local_a9f8 >> 10) & 1);
            local_9f80._40_4_ = (uint)bVar57 * auVar74._40_4_ | (uint)!bVar57 * local_9f80._40_4_;
            bVar57 = (bool)((byte)(local_a9f8 >> 0xb) & 1);
            local_9f80._44_4_ = (uint)bVar57 * auVar74._44_4_ | (uint)!bVar57 * local_9f80._44_4_;
            bVar57 = (bool)((byte)(local_a9f8 >> 0xc) & 1);
            local_9f80._48_4_ = (uint)bVar57 * auVar74._48_4_ | (uint)!bVar57 * local_9f80._48_4_;
            bVar57 = (bool)((byte)(local_a9f8 >> 0xd) & 1);
            local_9f80._52_4_ = (uint)bVar57 * auVar74._52_4_ | (uint)!bVar57 * local_9f80._52_4_;
            bVar57 = (bool)((byte)(local_a9f8 >> 0xe) & 1);
            local_9f80._56_4_ = (uint)bVar57 * auVar74._56_4_ | (uint)!bVar57 * local_9f80._56_4_;
            bVar57 = (bool)((byte)(local_a9f8 >> 0xf) & 1);
            local_9f80._60_4_ = (uint)bVar57 * auVar74._60_4_ | (uint)!bVar57 * local_9f80._60_4_;
            iVar70 = 2;
          }
          auVar76 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar74 = local_a900;
          if ((uint)uVar68 < (uint)local_a9d0) goto LAB_01e3d3a5;
        }
      } while ((iVar70 == 4) || (iVar70 == 2));
LAB_01e3e296:
      local_a9f8 = local_a9f8 & local_a9a8;
      auVar72 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      bVar57 = (bool)((byte)local_a9f8 & 1);
      bVar6 = (bool)((byte)(local_a9f8 >> 1) & 1);
      bVar7 = (bool)((byte)(local_a9f8 >> 2) & 1);
      bVar8 = (bool)((byte)(local_a9f8 >> 3) & 1);
      bVar9 = (bool)((byte)(local_a9f8 >> 4) & 1);
      bVar10 = (bool)((byte)(local_a9f8 >> 5) & 1);
      bVar11 = (bool)((byte)(local_a9f8 >> 6) & 1);
      bVar12 = (bool)((byte)(local_a9f8 >> 7) & 1);
      bVar14 = (bool)((byte)(local_a9f8 >> 8) & 1);
      bVar15 = (bool)((byte)(local_a9f8 >> 9) & 1);
      bVar16 = (bool)((byte)(local_a9f8 >> 10) & 1);
      bVar17 = (bool)((byte)(local_a9f8 >> 0xb) & 1);
      bVar18 = (bool)((byte)(local_a9f8 >> 0xc) & 1);
      bVar19 = (bool)((byte)(local_a9f8 >> 0xd) & 1);
      bVar20 = (bool)((byte)(local_a9f8 >> 0xe) & 1);
      bVar21 = (bool)((byte)(local_a9f8 >> 0xf) & 1);
      *(uint *)local_a9a0 = (uint)bVar57 * auVar72._0_4_ | (uint)!bVar57 * *(int *)local_a9a0;
      *(uint *)(local_a9a0 + 4) =
           (uint)bVar6 * auVar72._4_4_ | (uint)!bVar6 * *(int *)(local_a9a0 + 4);
      *(uint *)(local_a9a0 + 8) =
           (uint)bVar7 * auVar72._8_4_ | (uint)!bVar7 * *(int *)(local_a9a0 + 8);
      *(uint *)(local_a9a0 + 0xc) =
           (uint)bVar8 * auVar72._12_4_ | (uint)!bVar8 * *(int *)(local_a9a0 + 0xc);
      *(uint *)(local_a9a0 + 0x10) =
           (uint)bVar9 * auVar72._16_4_ | (uint)!bVar9 * *(int *)(local_a9a0 + 0x10);
      *(uint *)(local_a9a0 + 0x14) =
           (uint)bVar10 * auVar72._20_4_ | (uint)!bVar10 * *(int *)(local_a9a0 + 0x14);
      *(uint *)(local_a9a0 + 0x18) =
           (uint)bVar11 * auVar72._24_4_ | (uint)!bVar11 * *(int *)(local_a9a0 + 0x18);
      *(uint *)(local_a9a0 + 0x1c) =
           (uint)bVar12 * auVar72._28_4_ | (uint)!bVar12 * *(int *)(local_a9a0 + 0x1c);
      *(uint *)(local_a9a0 + 0x20) =
           (uint)bVar14 * auVar72._32_4_ | (uint)!bVar14 * *(int *)(local_a9a0 + 0x20);
      *(uint *)(local_a9a0 + 0x24) =
           (uint)bVar15 * auVar72._36_4_ | (uint)!bVar15 * *(int *)(local_a9a0 + 0x24);
      *(uint *)(local_a9a0 + 0x28) =
           (uint)bVar16 * auVar72._40_4_ | (uint)!bVar16 * *(int *)(local_a9a0 + 0x28);
      *(uint *)(local_a9a0 + 0x2c) =
           (uint)bVar17 * auVar72._44_4_ | (uint)!bVar17 * *(int *)(local_a9a0 + 0x2c);
      *(uint *)(local_a9a0 + 0x30) =
           (uint)bVar18 * auVar72._48_4_ | (uint)!bVar18 * *(int *)(local_a9a0 + 0x30);
      *(uint *)(local_a9a0 + 0x34) =
           (uint)bVar19 * auVar72._52_4_ | (uint)!bVar19 * *(int *)(local_a9a0 + 0x34);
      *(uint *)(local_a9a0 + 0x38) =
           (uint)bVar20 * auVar72._56_4_ | (uint)!bVar20 * *(int *)(local_a9a0 + 0x38);
      *(uint *)(local_a9a0 + 0x3c) =
           (uint)bVar21 * auVar72._60_4_ | (uint)!bVar21 * *(int *)(local_a9a0 + 0x3c);
    }
  }
  return;
LAB_01e3d5eb:
  do {
    if (lVar61 == local_a988) goto LAB_01e3e157;
    lVar62 = lVar61 * 0x50 + (root.ptr & 0xfffffffffffffff0);
    local_a9c0 = 0;
    local_a9b8 = (ulong)(local_a9e0 & 0xffff);
    for (uVar58 = local_a9b8; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
      local_a9c0 = local_a9c0 + 1;
    }
    uVar58 = (ulong)local_a9e0;
    lVar66 = 0;
    local_a9b0 = lVar61;
    do {
      if ((lVar66 == 4) || (*(int *)(lVar62 + 0x40 + lVar66 * 4) == -1)) goto LAB_01e3e13b;
      uVar60 = (uint)uVar58;
      local_a900._0_4_ = uVar60;
      pRVar2 = (context->scene->geometries).items;
      pGVar3 = pRVar2[*(uint *)(lVar62 + 0x30 + lVar66 * 4)].ptr;
      auVar111._8_8_ = 0;
      auVar111._0_4_ = (pGVar3->time_range).lower;
      auVar111._4_4_ = (pGVar3->time_range).upper;
      auVar74 = vbroadcastss_avx512f(auVar111);
      auVar75 = vbroadcastss_avx512f(ZEXT416((uint)pGVar3->fnumTimeSegments));
      auVar74 = vsubps_avx512f(*(undefined1 (*) [64])(ray + 0x1c0),auVar74);
      auVar71 = vmovshdup_avx(auVar111);
      auVar71 = vsubps_avx(auVar71,auVar111);
      auVar77 = vbroadcastss_avx512f(auVar71);
      auVar74 = vdivps_avx512f(auVar74,auVar77);
      auVar74 = vmulps_avx512f(auVar75,auVar74);
      auVar77 = vrndscaleps_avx512f(auVar74,1);
      auVar71 = vaddss_avx512f(auVar75._0_16_,SUB6416(ZEXT464(0xbf800000),0));
      auVar75 = vbroadcastss_avx512f(auVar71);
      auVar75 = vminps_avx512f(auVar77,auVar75);
      auVar75 = vmaxps_avx512f(auVar75,auVar73);
      auVar77 = vsubps_avx512f(auVar74,auVar75);
      auVar75 = vcvtps2dq_avx512f(auVar75);
      auVar74 = vmovdqa64_avx512f(auVar75);
      _local_a980 = auVar74;
      auVar78 = vpbroadcastd_avx512f();
      uVar23 = vpcmpd_avx512f(auVar78,auVar75,4);
      uVar69 = local_a9b8;
      uVar65 = local_a9c0;
      if (((ushort)uVar23 & (ushort)local_a9e0) == 0) {
        lVar61 = *(long *)(*(long *)&pGVar3[2].numPrimitives +
                          (long)*(int *)(local_a980 + local_a9c0 * 4) * 0x38);
        lVar4 = *(long *)(*(long *)&pGVar3[2].numPrimitives + 0x38 +
                         (long)*(int *)(local_a980 + local_a9c0 * 4) * 0x38);
        uVar65 = (ulong)*(uint *)(lVar62 + lVar66 * 4);
        uVar69 = (ulong)*(uint *)(lVar62 + 0x10 + lVar66 * 4);
        auVar85 = vsubps_avx512f(auVar76,auVar77);
        uVar1 = *(undefined4 *)(lVar4 + uVar65 * 4);
        auVar33._4_4_ = uVar1;
        auVar33._0_4_ = uVar1;
        auVar33._8_4_ = uVar1;
        auVar33._12_4_ = uVar1;
        auVar33._16_4_ = uVar1;
        auVar33._20_4_ = uVar1;
        auVar33._24_4_ = uVar1;
        auVar33._28_4_ = uVar1;
        auVar33._32_4_ = uVar1;
        auVar33._36_4_ = uVar1;
        auVar33._40_4_ = uVar1;
        auVar33._44_4_ = uVar1;
        auVar33._48_4_ = uVar1;
        auVar33._52_4_ = uVar1;
        auVar33._56_4_ = uVar1;
        auVar33._60_4_ = uVar1;
        auVar75 = vmulps_avx512f(auVar77,auVar33);
        uVar1 = *(undefined4 *)(lVar4 + 4 + uVar65 * 4);
        auVar34._4_4_ = uVar1;
        auVar34._0_4_ = uVar1;
        auVar34._8_4_ = uVar1;
        auVar34._12_4_ = uVar1;
        auVar34._16_4_ = uVar1;
        auVar34._20_4_ = uVar1;
        auVar34._24_4_ = uVar1;
        auVar34._28_4_ = uVar1;
        auVar34._32_4_ = uVar1;
        auVar34._36_4_ = uVar1;
        auVar34._40_4_ = uVar1;
        auVar34._44_4_ = uVar1;
        auVar34._48_4_ = uVar1;
        auVar34._52_4_ = uVar1;
        auVar34._56_4_ = uVar1;
        auVar34._60_4_ = uVar1;
        auVar78 = vmulps_avx512f(auVar77,auVar34);
        uVar1 = *(undefined4 *)(lVar4 + 8 + uVar65 * 4);
        auVar35._4_4_ = uVar1;
        auVar35._0_4_ = uVar1;
        auVar35._8_4_ = uVar1;
        auVar35._12_4_ = uVar1;
        auVar35._16_4_ = uVar1;
        auVar35._20_4_ = uVar1;
        auVar35._24_4_ = uVar1;
        auVar35._28_4_ = uVar1;
        auVar35._32_4_ = uVar1;
        auVar35._36_4_ = uVar1;
        auVar35._40_4_ = uVar1;
        auVar35._44_4_ = uVar1;
        auVar35._48_4_ = uVar1;
        auVar35._52_4_ = uVar1;
        auVar35._56_4_ = uVar1;
        auVar35._60_4_ = uVar1;
        auVar79 = vmulps_avx512f(auVar77,auVar35);
        uVar1 = *(undefined4 *)(lVar61 + uVar65 * 4);
        auVar36._4_4_ = uVar1;
        auVar36._0_4_ = uVar1;
        auVar36._8_4_ = uVar1;
        auVar36._12_4_ = uVar1;
        auVar36._16_4_ = uVar1;
        auVar36._20_4_ = uVar1;
        auVar36._24_4_ = uVar1;
        auVar36._28_4_ = uVar1;
        auVar36._32_4_ = uVar1;
        auVar36._36_4_ = uVar1;
        auVar36._40_4_ = uVar1;
        auVar36._44_4_ = uVar1;
        auVar36._48_4_ = uVar1;
        auVar36._52_4_ = uVar1;
        auVar36._56_4_ = uVar1;
        auVar36._60_4_ = uVar1;
        auVar80 = vfmadd231ps_avx512f(auVar75,auVar85,auVar36);
        uVar1 = *(undefined4 *)(lVar61 + 4 + uVar65 * 4);
        auVar37._4_4_ = uVar1;
        auVar37._0_4_ = uVar1;
        auVar37._8_4_ = uVar1;
        auVar37._12_4_ = uVar1;
        auVar37._16_4_ = uVar1;
        auVar37._20_4_ = uVar1;
        auVar37._24_4_ = uVar1;
        auVar37._28_4_ = uVar1;
        auVar37._32_4_ = uVar1;
        auVar37._36_4_ = uVar1;
        auVar37._40_4_ = uVar1;
        auVar37._44_4_ = uVar1;
        auVar37._48_4_ = uVar1;
        auVar37._52_4_ = uVar1;
        auVar37._56_4_ = uVar1;
        auVar37._60_4_ = uVar1;
        auVar75 = vfmadd231ps_avx512f(auVar78,auVar85,auVar37);
        uVar1 = *(undefined4 *)(lVar61 + 8 + uVar65 * 4);
        auVar38._4_4_ = uVar1;
        auVar38._0_4_ = uVar1;
        auVar38._8_4_ = uVar1;
        auVar38._12_4_ = uVar1;
        auVar38._16_4_ = uVar1;
        auVar38._20_4_ = uVar1;
        auVar38._24_4_ = uVar1;
        auVar38._28_4_ = uVar1;
        auVar38._32_4_ = uVar1;
        auVar38._36_4_ = uVar1;
        auVar38._40_4_ = uVar1;
        auVar38._44_4_ = uVar1;
        auVar38._48_4_ = uVar1;
        auVar38._52_4_ = uVar1;
        auVar38._56_4_ = uVar1;
        auVar38._60_4_ = uVar1;
        auVar79 = vfmadd231ps_avx512f(auVar79,auVar85,auVar38);
        uVar1 = *(undefined4 *)(lVar4 + uVar69 * 4);
        auVar39._4_4_ = uVar1;
        auVar39._0_4_ = uVar1;
        auVar39._8_4_ = uVar1;
        auVar39._12_4_ = uVar1;
        auVar39._16_4_ = uVar1;
        auVar39._20_4_ = uVar1;
        auVar39._24_4_ = uVar1;
        auVar39._28_4_ = uVar1;
        auVar39._32_4_ = uVar1;
        auVar39._36_4_ = uVar1;
        auVar39._40_4_ = uVar1;
        auVar39._44_4_ = uVar1;
        auVar39._48_4_ = uVar1;
        auVar39._52_4_ = uVar1;
        auVar39._56_4_ = uVar1;
        auVar39._60_4_ = uVar1;
        auVar78 = vmulps_avx512f(auVar77,auVar39);
        uVar1 = *(undefined4 *)(lVar4 + 4 + uVar69 * 4);
        auVar40._4_4_ = uVar1;
        auVar40._0_4_ = uVar1;
        auVar40._8_4_ = uVar1;
        auVar40._12_4_ = uVar1;
        auVar40._16_4_ = uVar1;
        auVar40._20_4_ = uVar1;
        auVar40._24_4_ = uVar1;
        auVar40._28_4_ = uVar1;
        auVar40._32_4_ = uVar1;
        auVar40._36_4_ = uVar1;
        auVar40._40_4_ = uVar1;
        auVar40._44_4_ = uVar1;
        auVar40._48_4_ = uVar1;
        auVar40._52_4_ = uVar1;
        auVar40._56_4_ = uVar1;
        auVar40._60_4_ = uVar1;
        auVar81 = vmulps_avx512f(auVar77,auVar40);
        uVar1 = *(undefined4 *)(lVar4 + 8 + uVar69 * 4);
        auVar41._4_4_ = uVar1;
        auVar41._0_4_ = uVar1;
        auVar41._8_4_ = uVar1;
        auVar41._12_4_ = uVar1;
        auVar41._16_4_ = uVar1;
        auVar41._20_4_ = uVar1;
        auVar41._24_4_ = uVar1;
        auVar41._28_4_ = uVar1;
        auVar41._32_4_ = uVar1;
        auVar41._36_4_ = uVar1;
        auVar41._40_4_ = uVar1;
        auVar41._44_4_ = uVar1;
        auVar41._48_4_ = uVar1;
        auVar41._52_4_ = uVar1;
        auVar41._56_4_ = uVar1;
        auVar41._60_4_ = uVar1;
        auVar83 = vmulps_avx512f(auVar77,auVar41);
        uVar1 = *(undefined4 *)(lVar61 + uVar69 * 4);
        auVar42._4_4_ = uVar1;
        auVar42._0_4_ = uVar1;
        auVar42._8_4_ = uVar1;
        auVar42._12_4_ = uVar1;
        auVar42._16_4_ = uVar1;
        auVar42._20_4_ = uVar1;
        auVar42._24_4_ = uVar1;
        auVar42._28_4_ = uVar1;
        auVar42._32_4_ = uVar1;
        auVar42._36_4_ = uVar1;
        auVar42._40_4_ = uVar1;
        auVar42._44_4_ = uVar1;
        auVar42._48_4_ = uVar1;
        auVar42._52_4_ = uVar1;
        auVar42._56_4_ = uVar1;
        auVar42._60_4_ = uVar1;
        auVar82 = vfmadd231ps_avx512f(auVar78,auVar85,auVar42);
        uVar1 = *(undefined4 *)(lVar61 + 4 + uVar69 * 4);
        auVar43._4_4_ = uVar1;
        auVar43._0_4_ = uVar1;
        auVar43._8_4_ = uVar1;
        auVar43._12_4_ = uVar1;
        auVar43._16_4_ = uVar1;
        auVar43._20_4_ = uVar1;
        auVar43._24_4_ = uVar1;
        auVar43._28_4_ = uVar1;
        auVar43._32_4_ = uVar1;
        auVar43._36_4_ = uVar1;
        auVar43._40_4_ = uVar1;
        auVar43._44_4_ = uVar1;
        auVar43._48_4_ = uVar1;
        auVar43._52_4_ = uVar1;
        auVar43._56_4_ = uVar1;
        auVar43._60_4_ = uVar1;
        auVar81 = vfmadd231ps_avx512f(auVar81,auVar85,auVar43);
        uVar1 = *(undefined4 *)(lVar61 + 8 + uVar69 * 4);
        auVar44._4_4_ = uVar1;
        auVar44._0_4_ = uVar1;
        auVar44._8_4_ = uVar1;
        auVar44._12_4_ = uVar1;
        auVar44._16_4_ = uVar1;
        auVar44._20_4_ = uVar1;
        auVar44._24_4_ = uVar1;
        auVar44._28_4_ = uVar1;
        auVar44._32_4_ = uVar1;
        auVar44._36_4_ = uVar1;
        auVar44._40_4_ = uVar1;
        auVar44._44_4_ = uVar1;
        auVar44._48_4_ = uVar1;
        auVar44._52_4_ = uVar1;
        auVar44._56_4_ = uVar1;
        auVar44._60_4_ = uVar1;
        auVar83 = vfmadd231ps_avx512f(auVar83,auVar85,auVar44);
        uVar65 = (ulong)*(uint *)(lVar62 + 0x20 + lVar66 * 4);
        uVar1 = *(undefined4 *)(lVar4 + uVar65 * 4);
        auVar45._4_4_ = uVar1;
        auVar45._0_4_ = uVar1;
        auVar45._8_4_ = uVar1;
        auVar45._12_4_ = uVar1;
        auVar45._16_4_ = uVar1;
        auVar45._20_4_ = uVar1;
        auVar45._24_4_ = uVar1;
        auVar45._28_4_ = uVar1;
        auVar45._32_4_ = uVar1;
        auVar45._36_4_ = uVar1;
        auVar45._40_4_ = uVar1;
        auVar45._44_4_ = uVar1;
        auVar45._48_4_ = uVar1;
        auVar45._52_4_ = uVar1;
        auVar45._56_4_ = uVar1;
        auVar45._60_4_ = uVar1;
        auVar78 = vmulps_avx512f(auVar77,auVar45);
        uVar1 = *(undefined4 *)(lVar4 + 4 + uVar65 * 4);
        auVar46._4_4_ = uVar1;
        auVar46._0_4_ = uVar1;
        auVar46._8_4_ = uVar1;
        auVar46._12_4_ = uVar1;
        auVar46._16_4_ = uVar1;
        auVar46._20_4_ = uVar1;
        auVar46._24_4_ = uVar1;
        auVar46._28_4_ = uVar1;
        auVar46._32_4_ = uVar1;
        auVar46._36_4_ = uVar1;
        auVar46._40_4_ = uVar1;
        auVar46._44_4_ = uVar1;
        auVar46._48_4_ = uVar1;
        auVar46._52_4_ = uVar1;
        auVar46._56_4_ = uVar1;
        auVar46._60_4_ = uVar1;
        auVar84 = vmulps_avx512f(auVar77,auVar46);
        uVar1 = *(undefined4 *)(lVar4 + 8 + uVar65 * 4);
        auVar47._4_4_ = uVar1;
        auVar47._0_4_ = uVar1;
        auVar47._8_4_ = uVar1;
        auVar47._12_4_ = uVar1;
        auVar47._16_4_ = uVar1;
        auVar47._20_4_ = uVar1;
        auVar47._24_4_ = uVar1;
        auVar47._28_4_ = uVar1;
        auVar47._32_4_ = uVar1;
        auVar47._36_4_ = uVar1;
        auVar47._40_4_ = uVar1;
        auVar47._44_4_ = uVar1;
        auVar47._48_4_ = uVar1;
        auVar47._52_4_ = uVar1;
        auVar47._56_4_ = uVar1;
        auVar47._60_4_ = uVar1;
        auVar77 = vmulps_avx512f(auVar77,auVar47);
        uVar1 = *(undefined4 *)(lVar61 + uVar65 * 4);
        auVar48._4_4_ = uVar1;
        auVar48._0_4_ = uVar1;
        auVar48._8_4_ = uVar1;
        auVar48._12_4_ = uVar1;
        auVar48._16_4_ = uVar1;
        auVar48._20_4_ = uVar1;
        auVar48._24_4_ = uVar1;
        auVar48._28_4_ = uVar1;
        auVar48._32_4_ = uVar1;
        auVar48._36_4_ = uVar1;
        auVar48._40_4_ = uVar1;
        auVar48._44_4_ = uVar1;
        auVar48._48_4_ = uVar1;
        auVar48._52_4_ = uVar1;
        auVar48._56_4_ = uVar1;
        auVar48._60_4_ = uVar1;
        auVar78 = vfmadd231ps_avx512f(auVar78,auVar85,auVar48);
        uVar1 = *(undefined4 *)(lVar61 + 4 + uVar65 * 4);
        auVar49._4_4_ = uVar1;
        auVar49._0_4_ = uVar1;
        auVar49._8_4_ = uVar1;
        auVar49._12_4_ = uVar1;
        auVar49._16_4_ = uVar1;
        auVar49._20_4_ = uVar1;
        auVar49._24_4_ = uVar1;
        auVar49._28_4_ = uVar1;
        auVar49._32_4_ = uVar1;
        auVar49._36_4_ = uVar1;
        auVar49._40_4_ = uVar1;
        auVar49._44_4_ = uVar1;
        auVar49._48_4_ = uVar1;
        auVar49._52_4_ = uVar1;
        auVar49._56_4_ = uVar1;
        auVar49._60_4_ = uVar1;
        auVar84 = vfmadd231ps_avx512f(auVar84,auVar85,auVar49);
        uVar1 = *(undefined4 *)(lVar61 + 8 + uVar65 * 4);
        auVar50._4_4_ = uVar1;
        auVar50._0_4_ = uVar1;
        auVar50._8_4_ = uVar1;
        auVar50._12_4_ = uVar1;
        auVar50._16_4_ = uVar1;
        auVar50._20_4_ = uVar1;
        auVar50._24_4_ = uVar1;
        auVar50._28_4_ = uVar1;
        auVar50._32_4_ = uVar1;
        auVar50._36_4_ = uVar1;
        auVar50._40_4_ = uVar1;
        auVar50._44_4_ = uVar1;
        auVar50._48_4_ = uVar1;
        auVar50._52_4_ = uVar1;
        auVar50._56_4_ = uVar1;
        auVar50._60_4_ = uVar1;
        auVar77 = vfmadd231ps_avx512f(auVar77,auVar85,auVar50);
      }
      else {
        while (uVar69 != 0) {
          uVar64 = (ulong)*(uint *)(lVar62 + lVar66 * 4);
          auVar71 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar3[2].numPrimitives +
                               (long)*(int *)(local_a980 + uVar65 * 4) * 0x38) + uVar64 * 4);
          auVar111 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar3[2].numPrimitives + 0x38 +
                                (long)*(int *)(local_a980 + uVar65 * 4) * 0x38) + uVar64 * 4);
          *(int *)((long)&local_a780 + uVar65 * 4) = auVar71._0_4_;
          uVar1 = vextractps_avx(auVar71,1);
          *(undefined4 *)((long)&local_a780 + uVar65 * 4 + 0x40) = uVar1;
          uVar1 = vextractps_avx(auVar71,2);
          *(undefined4 *)((long)&local_a780 + uVar65 * 4 + 0x80) = uVar1;
          *(int *)((long)&local_a880 + uVar65 * 4) = auVar111._0_4_;
          uVar1 = vextractps_avx(auVar111,1);
          *(undefined4 *)((long)&local_a840 + uVar65 * 4) = uVar1;
          uVar1 = vextractps_avx(auVar111,2);
          *(undefined4 *)((long)&local_a800 + uVar65 * 4) = uVar1;
          uVar64 = uVar65 & 0x3f;
          uVar65 = 0;
          uVar69 = uVar69 ^ 1L << uVar64;
          for (uVar64 = uVar69; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
            uVar65 = uVar65 + 1;
          }
        }
        auVar78 = vsubps_avx512f(auVar76,auVar77);
        auVar83._8_8_ = local_a780._8_8_;
        auVar83._0_8_ = local_a780._0_8_;
        auVar83._16_8_ = local_a780._16_8_;
        auVar83._24_8_ = local_a780._24_8_;
        auVar83._32_8_ = local_a780._32_8_;
        auVar83._40_8_ = local_a780._40_8_;
        auVar83._48_8_ = local_a780._48_8_;
        auVar83._56_8_ = local_a780._56_8_;
        auVar85._8_8_ = local_a780._136_8_;
        auVar85._0_8_ = local_a780._128_8_;
        auVar85._16_8_ = local_a780._144_8_;
        auVar85._24_8_ = local_a780._152_8_;
        auVar85._32_8_ = local_a780._160_8_;
        auVar85._40_8_ = local_a780._168_8_;
        auVar85._48_8_ = local_a780._176_8_;
        auVar85._56_8_ = local_a780._184_8_;
        auVar84._8_8_ = local_a780._72_8_;
        auVar84._0_8_ = local_a780._64_8_;
        auVar84._16_8_ = local_a780._80_8_;
        auVar84._24_8_ = local_a780._88_8_;
        auVar84._32_8_ = local_a780._96_8_;
        auVar84._40_8_ = local_a780._104_8_;
        auVar84._48_8_ = local_a780._112_8_;
        auVar84._56_8_ = local_a780._120_8_;
        auVar75 = vmulps_avx512f(auVar78,auVar84);
        auVar80._8_8_ = uStack_a878;
        auVar80._0_8_ = local_a880;
        auVar80._16_8_ = uStack_a870;
        auVar80._24_8_ = uStack_a868;
        auVar80._32_8_ = uStack_a860;
        auVar80._40_8_ = uStack_a858;
        auVar80._48_8_ = uStack_a850;
        auVar80._56_8_ = uStack_a848;
        auVar81._8_8_ = uStack_a838;
        auVar81._0_8_ = local_a840;
        auVar81._16_8_ = uStack_a830;
        auVar81._24_8_ = uStack_a828;
        auVar81._32_8_ = uStack_a820;
        auVar81._40_8_ = uStack_a818;
        auVar81._48_8_ = uStack_a810;
        auVar81._56_8_ = uStack_a808;
        auVar79 = vmulps_avx512f(auVar77,auVar81);
        auVar75 = vaddps_avx512f(auVar75,auVar79);
        auVar82._8_8_ = uStack_a7f8;
        auVar82._0_8_ = local_a800;
        auVar82._16_8_ = uStack_a7f0;
        auVar82._24_8_ = uStack_a7e8;
        auVar82._32_8_ = uStack_a7e0;
        auVar82._40_8_ = uStack_a7d8;
        auVar82._48_8_ = uStack_a7d0;
        auVar82._56_8_ = uStack_a7c8;
        auVar79 = vmulps_avx512f(auVar77,auVar82);
        uVar69 = local_a9b8;
        uVar65 = local_a9c0;
        while (uVar69 != 0) {
          uVar64 = (ulong)*(uint *)(lVar62 + 0x10 + lVar66 * 4);
          auVar71 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar3[2].numPrimitives +
                               (long)*(int *)(local_a980 + uVar65 * 4) * 0x38) + uVar64 * 4);
          auVar111 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar3[2].numPrimitives + 0x38 +
                                (long)*(int *)(local_a980 + uVar65 * 4) * 0x38) + uVar64 * 4);
          *(int *)((long)&local_a780 + uVar65 * 4) = auVar71._0_4_;
          uVar1 = vextractps_avx(auVar71,1);
          *(undefined4 *)((long)&local_a780 + uVar65 * 4 + 0x40) = uVar1;
          uVar1 = vextractps_avx(auVar71,2);
          *(undefined4 *)((long)&local_a780 + uVar65 * 4 + 0x80) = uVar1;
          *(int *)((long)&local_a880 + uVar65 * 4) = auVar111._0_4_;
          uVar1 = vextractps_avx(auVar111,1);
          *(undefined4 *)((long)&local_a840 + uVar65 * 4) = uVar1;
          uVar1 = vextractps_avx(auVar111,2);
          *(undefined4 *)((long)&local_a800 + uVar65 * 4) = uVar1;
          uVar64 = uVar65 & 0x3f;
          uVar65 = 0;
          uVar69 = uVar69 ^ 1L << uVar64;
          for (uVar64 = uVar69; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
            uVar65 = uVar65 + 1;
          }
        }
        auVar81 = vmulps_avx512f(auVar78,auVar83);
        auVar80 = vmulps_avx512f(auVar77,auVar80);
        auVar90._8_8_ = local_a780._8_8_;
        auVar90._0_8_ = local_a780._0_8_;
        auVar90._16_8_ = local_a780._16_8_;
        auVar90._24_8_ = local_a780._24_8_;
        auVar90._32_8_ = local_a780._32_8_;
        auVar90._40_8_ = local_a780._40_8_;
        auVar90._48_8_ = local_a780._48_8_;
        auVar90._56_8_ = local_a780._56_8_;
        auVar92._8_8_ = local_a780._136_8_;
        auVar92._0_8_ = local_a780._128_8_;
        auVar92._16_8_ = local_a780._144_8_;
        auVar92._24_8_ = local_a780._152_8_;
        auVar92._32_8_ = local_a780._160_8_;
        auVar92._40_8_ = local_a780._168_8_;
        auVar92._48_8_ = local_a780._176_8_;
        auVar92._56_8_ = local_a780._184_8_;
        auVar91._8_8_ = local_a780._72_8_;
        auVar91._0_8_ = local_a780._64_8_;
        auVar91._16_8_ = local_a780._80_8_;
        auVar91._24_8_ = local_a780._88_8_;
        auVar91._32_8_ = local_a780._96_8_;
        auVar91._40_8_ = local_a780._104_8_;
        auVar91._48_8_ = local_a780._112_8_;
        auVar91._56_8_ = local_a780._120_8_;
        auVar82 = vmulps_avx512f(auVar78,auVar91);
        auVar87._8_8_ = uStack_a878;
        auVar87._0_8_ = local_a880;
        auVar87._16_8_ = uStack_a870;
        auVar87._24_8_ = uStack_a868;
        auVar87._32_8_ = uStack_a860;
        auVar87._40_8_ = uStack_a858;
        auVar87._48_8_ = uStack_a850;
        auVar87._56_8_ = uStack_a848;
        auVar80 = vaddps_avx512f(auVar81,auVar80);
        auVar88._8_8_ = uStack_a838;
        auVar88._0_8_ = local_a840;
        auVar88._16_8_ = uStack_a830;
        auVar88._24_8_ = uStack_a828;
        auVar88._32_8_ = uStack_a820;
        auVar88._40_8_ = uStack_a818;
        auVar88._48_8_ = uStack_a810;
        auVar88._56_8_ = uStack_a808;
        auVar81 = vmulps_avx512f(auVar77,auVar88);
        auVar81 = vaddps_avx512f(auVar82,auVar81);
        auVar89._8_8_ = uStack_a7f8;
        auVar89._0_8_ = local_a800;
        auVar89._16_8_ = uStack_a7f0;
        auVar89._24_8_ = uStack_a7e8;
        auVar89._32_8_ = uStack_a7e0;
        auVar89._40_8_ = uStack_a7d8;
        auVar89._48_8_ = uStack_a7d0;
        auVar89._56_8_ = uStack_a7c8;
        auVar82 = vmulps_avx512f(auVar77,auVar89);
        uVar69 = local_a9b8;
        uVar65 = local_a9c0;
        while (uVar69 != 0) {
          uVar64 = (ulong)*(uint *)(lVar62 + 0x20 + lVar66 * 4);
          auVar71 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar3[2].numPrimitives +
                               (long)*(int *)(local_a980 + uVar65 * 4) * 0x38) + uVar64 * 4);
          auVar111 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar3[2].numPrimitives + 0x38 +
                                (long)*(int *)(local_a980 + uVar65 * 4) * 0x38) + uVar64 * 4);
          *(int *)((long)&local_a780 + uVar65 * 4) = auVar71._0_4_;
          uVar1 = vextractps_avx(auVar71,1);
          *(undefined4 *)((long)&local_a780 + uVar65 * 4 + 0x40) = uVar1;
          uVar1 = vextractps_avx(auVar71,2);
          *(undefined4 *)((long)&local_a780 + uVar65 * 4 + 0x80) = uVar1;
          *(int *)((long)&local_a880 + uVar65 * 4) = auVar111._0_4_;
          uVar1 = vextractps_avx(auVar111,1);
          *(undefined4 *)((long)&local_a840 + uVar65 * 4) = uVar1;
          uVar1 = vextractps_avx(auVar111,2);
          *(undefined4 *)((long)&local_a800 + uVar65 * 4) = uVar1;
          uVar64 = uVar65 & 0x3f;
          uVar65 = 0;
          uVar69 = uVar69 ^ 1L << uVar64;
          for (uVar64 = uVar69; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
            uVar65 = uVar65 + 1;
          }
        }
        auVar83 = vmulps_avx512f(auVar78,auVar85);
        auVar79 = vaddps_avx512f(auVar83,auVar79);
        auVar84 = vmulps_avx512f(auVar78,auVar90);
        auVar83 = vmulps_avx512f(auVar78,auVar92);
        auVar83 = vaddps_avx512f(auVar83,auVar82);
        auVar82 = vmulps_avx512f(auVar77,auVar87);
        auVar53._8_8_ = local_a780._8_8_;
        auVar53._0_8_ = local_a780._0_8_;
        auVar53._16_8_ = local_a780._16_8_;
        auVar53._24_8_ = local_a780._24_8_;
        auVar53._32_8_ = local_a780._32_8_;
        auVar53._40_8_ = local_a780._40_8_;
        auVar53._48_8_ = local_a780._48_8_;
        auVar53._56_8_ = local_a780._56_8_;
        auVar85 = vmulps_avx512f(auVar78,auVar53);
        auVar54._8_8_ = local_a780._72_8_;
        auVar54._0_8_ = local_a780._64_8_;
        auVar54._16_8_ = local_a780._80_8_;
        auVar54._24_8_ = local_a780._88_8_;
        auVar54._32_8_ = local_a780._96_8_;
        auVar54._40_8_ = local_a780._104_8_;
        auVar54._48_8_ = local_a780._112_8_;
        auVar54._56_8_ = local_a780._120_8_;
        auVar87 = vmulps_avx512f(auVar78,auVar54);
        auVar82 = vaddps_avx512f(auVar84,auVar82);
        auVar55._8_8_ = local_a780._136_8_;
        auVar55._0_8_ = local_a780._128_8_;
        auVar55._16_8_ = local_a780._144_8_;
        auVar55._24_8_ = local_a780._152_8_;
        auVar55._32_8_ = local_a780._160_8_;
        auVar55._40_8_ = local_a780._168_8_;
        auVar55._48_8_ = local_a780._176_8_;
        auVar55._56_8_ = local_a780._184_8_;
        auVar88 = vmulps_avx512f(auVar78,auVar55);
        auVar93._8_8_ = uStack_a878;
        auVar93._0_8_ = local_a880;
        auVar93._16_8_ = uStack_a870;
        auVar93._24_8_ = uStack_a868;
        auVar93._32_8_ = uStack_a860;
        auVar93._40_8_ = uStack_a858;
        auVar93._48_8_ = uStack_a850;
        auVar93._56_8_ = uStack_a848;
        auVar78 = vmulps_avx512f(auVar77,auVar93);
        auVar78 = vaddps_avx512f(auVar85,auVar78);
        auVar94._8_8_ = uStack_a838;
        auVar94._0_8_ = local_a840;
        auVar94._16_8_ = uStack_a830;
        auVar94._24_8_ = uStack_a828;
        auVar94._32_8_ = uStack_a820;
        auVar94._40_8_ = uStack_a818;
        auVar94._48_8_ = uStack_a810;
        auVar94._56_8_ = uStack_a808;
        auVar84 = vmulps_avx512f(auVar77,auVar94);
        auVar84 = vaddps_avx512f(auVar87,auVar84);
        auVar52._8_8_ = uStack_a7f8;
        auVar52._0_8_ = local_a800;
        auVar52._16_8_ = uStack_a7f0;
        auVar52._24_8_ = uStack_a7e8;
        auVar52._32_8_ = uStack_a7e0;
        auVar52._40_8_ = uStack_a7d8;
        auVar52._48_8_ = uStack_a7d0;
        auVar52._56_8_ = uStack_a7c8;
        auVar77 = vmulps_avx512f(auVar77,auVar52);
        auVar77 = vaddps_avx512f(auVar88,auVar77);
      }
      local_a890 = *(undefined8 *)(lVar62 + 0x30);
      uStack_a888 = *(undefined8 *)(lVar62 + 0x38);
      local_a8a0 = *(undefined8 *)(lVar62 + 0x40);
      uStack_a898 = *(undefined8 *)(lVar62 + 0x48);
      auVar82 = vsubps_avx512f(auVar80,auVar82);
      auVar81 = vsubps_avx512f(auVar75,auVar81);
      auVar83 = vsubps_avx512f(auVar79,auVar83);
      auVar85 = vsubps_avx512f(auVar78,auVar80);
      auVar84 = vsubps_avx512f(auVar84,auVar75);
      auVar87 = vsubps_avx512f(auVar77,auVar79);
      auVar77 = vmulps_avx512f(auVar81,auVar87);
      auVar88 = vfmsub231ps_avx512f(auVar77,auVar84,auVar83);
      auVar77 = vmulps_avx512f(auVar83,auVar85);
      auVar89 = vfmsub231ps_avx512f(auVar77,auVar87,auVar82);
      auVar90 = vmulps_avx512f(auVar82,auVar84);
      auVar80 = vsubps_avx512f(auVar80,*(undefined1 (*) [64])ray);
      auVar91 = vsubps_avx512f(auVar75,*(undefined1 (*) [64])(ray + 0x40));
      auVar79 = vsubps_avx512f(auVar79,*(undefined1 (*) [64])(ray + 0x80));
      auVar75 = *(undefined1 (*) [64])(ray + 0x100);
      auVar77 = *(undefined1 (*) [64])(ray + 0x140);
      auVar78 = *(undefined1 (*) [64])(ray + 0x180);
      auVar90 = vfmsub231ps_avx512f(auVar90,auVar85,auVar81);
      auVar92 = vmulps_avx512f(auVar77,auVar79);
      auVar92 = vfmsub231ps_avx512f(auVar92,auVar91,auVar78);
      auVar93 = vmulps_avx512f(auVar78,auVar80);
      auVar93 = vfmsub231ps_avx512f(auVar93,auVar79,auVar75);
      auVar94 = vmulps_avx512f(auVar75,auVar91);
      auVar94 = vfmsub231ps_avx512f(auVar94,auVar80,auVar77);
      auVar78 = vmulps_avx512f(auVar90,auVar78);
      auVar77 = vfmadd231ps_avx512f(auVar78,auVar89,auVar77);
      auVar75 = vfmadd231ps_avx512f(auVar77,auVar88,auVar75);
      auVar77 = vandps_avx512dq(auVar75,auVar112);
      auVar78 = vmulps_avx512f(auVar87,auVar94);
      auVar78 = vfmadd231ps_avx512f(auVar78,auVar93,auVar84);
      auVar78 = vfmadd231ps_avx512f(auVar78,auVar92,auVar85);
      auVar78 = vxorps_avx512dq(auVar77,auVar78);
      uVar23 = vcmpps_avx512f(auVar78,auVar73,5);
      uVar59 = (ushort)uVar23 & (ushort)uVar58;
      if (uVar59 == 0) {
        uVar59 = 0;
      }
      else {
        auVar83 = vmulps_avx512f(auVar83,auVar94);
        auVar81 = vfmadd213ps_avx512f(auVar93,auVar81,auVar83);
        auVar81 = vfmadd213ps_avx512f(auVar92,auVar82,auVar81);
        auVar81 = vxorps_avx512dq(auVar77,auVar81);
        uVar23 = vcmpps_avx512f(auVar81,auVar73,5);
        uVar59 = uVar59 & (ushort)uVar23;
        if (uVar59 != 0) {
          auVar51._8_4_ = 0x7fffffff;
          auVar51._0_8_ = 0x7fffffff7fffffff;
          auVar51._12_4_ = 0x7fffffff;
          auVar51._16_4_ = 0x7fffffff;
          auVar51._20_4_ = 0x7fffffff;
          auVar51._24_4_ = 0x7fffffff;
          auVar51._28_4_ = 0x7fffffff;
          auVar51._32_4_ = 0x7fffffff;
          auVar51._36_4_ = 0x7fffffff;
          auVar51._40_4_ = 0x7fffffff;
          auVar51._44_4_ = 0x7fffffff;
          auVar51._48_4_ = 0x7fffffff;
          auVar51._52_4_ = 0x7fffffff;
          auVar51._56_4_ = 0x7fffffff;
          auVar51._60_4_ = 0x7fffffff;
          auVar82 = vandpd_avx512dq(auVar75,auVar51);
          auVar83 = vsubps_avx512f(auVar82,auVar78);
          uVar23 = vcmpps_avx512f(auVar83,auVar81,5);
          uVar59 = uVar59 & (ushort)uVar23;
          if (uVar59 != 0) {
            auVar72 = vmulps_avx512f(auVar90,auVar79);
            auVar72 = vfmadd213ps_avx512f(auVar91,auVar89,auVar72);
            auVar72 = vfmadd213ps_avx512f(auVar80,auVar88,auVar72);
            auVar72 = vxorps_avx512dq(auVar77,auVar72);
            auVar112 = vmulps_avx512f(auVar82,*(undefined1 (*) [64])(ray + 0xc0));
            auVar77 = vmulps_avx512f(auVar82,*(undefined1 (*) [64])(ray + 0x200));
            uVar23 = vcmpps_avx512f(auVar72,auVar77,2);
            uVar24 = vcmpps_avx512f(auVar112,auVar72,1);
            uVar59 = uVar59 & (ushort)uVar23 & (ushort)uVar24;
            if (uVar59 == 0) {
LAB_01e3e135:
              uVar59 = 0;
            }
            else {
              uVar23 = vcmpps_avx512f(auVar75,ZEXT1664(ZEXT816(0) << 0x40),4);
              uVar59 = uVar59 & (ushort)uVar23;
              if (uVar59 == 0) goto LAB_01e3e135;
              local_a3c0 = auVar78;
              local_a400 = auVar81;
              local_a440 = auVar72;
              local_a480 = auVar82;
              local_a4c0 = auVar88;
              local_a500 = auVar89;
              local_a540 = auVar90;
            }
            auVar72 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
            auVar71 = vxorps_avx512vl(auVar73._0_16_,auVar73._0_16_);
            auVar73 = ZEXT1664(auVar71);
            auVar112 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
            goto LAB_01e3d8a3;
          }
        }
        uVar59 = 0;
      }
LAB_01e3d8a3:
      auVar71 = auVar73._0_16_;
      local_a7c0._0_8_ = CONCAT44(0,*(uint *)((long)&local_a890 + lVar66 * 4));
      local_a9d0 = pRVar2[local_a7c0._0_8_].ptr;
      auVar75 = vpbroadcastd_avx512f(ZEXT416(local_a9d0->mask));
      uVar23 = vptestmd_avx512f(auVar75,*(undefined1 (*) [64])(ray + 0x240));
      uVar59 = (ushort)uVar23 & uVar59;
      lVar61 = local_a9b0;
      if (uVar59 != 0) {
        if ((local_a9d8->args->filter != (RTCFilterFunctionN)0x0) ||
           (local_a9d0->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar72 = vrcp14ps_avx512f(local_a480);
          auVar112 = vfnmadd213ps_avx512f(auVar72,local_a480,auVar76);
          auVar72 = vfmadd132ps_avx512f(auVar112,auVar72,auVar72);
          local_a6c0 = vmulps_avx512f(auVar72,local_a440);
          local_a640 = vmulps_avx512f(auVar72,local_a3c0);
          local_a680 = vmulps_avx512f(auVar72,local_a400);
          local_a780._0_8_ = local_a4c0._0_8_;
          local_a780._8_8_ = local_a4c0._8_8_;
          local_a780._16_8_ = local_a4c0._16_8_;
          local_a780._24_8_ = local_a4c0._24_8_;
          local_a780._32_8_ = local_a4c0._32_8_;
          local_a780._40_8_ = local_a4c0._40_8_;
          local_a780._48_8_ = local_a4c0._48_8_;
          local_a780._56_8_ = local_a4c0._56_8_;
          local_a780._64_8_ = local_a500._0_8_;
          local_a780._72_8_ = local_a500._8_8_;
          local_a780._80_8_ = local_a500._16_8_;
          local_a780._88_8_ = local_a500._24_8_;
          local_a780._96_8_ = local_a500._32_8_;
          local_a780._104_8_ = local_a500._40_8_;
          local_a780._112_8_ = local_a500._48_8_;
          local_a780._120_8_ = local_a500._56_8_;
          local_a780._128_8_ = local_a540._0_8_;
          local_a780._136_8_ = local_a540._8_8_;
          local_a780._144_8_ = local_a540._16_8_;
          local_a780._152_8_ = local_a540._24_8_;
          local_a780._160_8_ = local_a540._32_8_;
          local_a780._168_8_ = local_a540._40_8_;
          local_a780._176_8_ = local_a540._48_8_;
          local_a780._184_8_ = local_a540._56_8_;
          local_a980._8_8_ = (vfloat_impl<16> *)local_9f40;
          local_a980._0_8_ = &local_a880;
          _Stack_a970._M_head_impl = (vfloat_impl<16> *)local_9f00;
          auStack_a960 = auVar74._32_32_;
          _Stack_a968._M_head_impl = (vfloat_impl<16> *)local_9ec0;
          local_a9c8 = lVar62;
          local_a9a4 = *(undefined4 *)((long)&local_a8a0 + lVar66 * 4);
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<16>&,embree::vfloat_impl<16>&,embree::vfloat_impl<16>&,embree::Vec3<embree::vfloat_impl<16>>&>
          ::
          _M_assign<embree::vfloat_impl<16>,embree::vfloat_impl<16>,embree::vfloat_impl<16>,embree::Vec3<embree::vfloat_impl<16>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<16>_&,_embree::vfloat_impl<16>_&,_embree::vfloat_impl<16>_&,_embree::Vec3<embree::vfloat_impl<16>_>_&>
                      *)local_a980,
                     (_Tuple_impl<0UL,_embree::vfloat_impl<16>,_embree::vfloat_impl<16>,_embree::vfloat_impl<16>,_embree::Vec3<embree::vfloat_impl<16>_>_>
                      *)&local_a780.field_0);
          auVar72 = vpbroadcastd_avx512f();
          auVar112 = vpbroadcastd_avx512f();
          local_a780._0_8_ = local_a880;
          local_a780._8_8_ = uStack_a878;
          local_a780._16_8_ = uStack_a870;
          local_a780._24_8_ = uStack_a868;
          local_a780._32_8_ = uStack_a860;
          local_a780._40_8_ = uStack_a858;
          local_a780._48_8_ = uStack_a850;
          local_a780._56_8_ = uStack_a848;
          local_a780._64_8_ = local_a840;
          local_a780._72_8_ = uStack_a838;
          local_a780._80_8_ = uStack_a830;
          local_a780._88_8_ = uStack_a828;
          local_a780._96_8_ = uStack_a820;
          local_a780._104_8_ = uStack_a818;
          local_a780._112_8_ = uStack_a810;
          local_a780._120_8_ = uStack_a808;
          local_a780._128_8_ = local_a800;
          local_a780._136_8_ = uStack_a7f8;
          local_a780._144_8_ = uStack_a7f0;
          local_a780._152_8_ = uStack_a7e8;
          local_a780._160_8_ = uStack_a7e0;
          local_a780._168_8_ = uStack_a7d8;
          local_a780._176_8_ = uStack_a7d0;
          local_a780._184_8_ = uStack_a7c8;
          local_a640 = vmovdqa64_avx512f(auVar112);
          local_a600 = vmovdqa64_avx512f(auVar72);
          vpcmpeqd_avx2(auVar72._0_32_,auVar72._0_32_);
          local_a5c0 = vbroadcastss_avx512f(ZEXT416(local_a9d8->user->instID[0]));
          local_a580 = vbroadcastss_avx512f(ZEXT416(local_a9d8->user->instPrimID[0]));
          local_a7c0 = *(undefined1 (*) [64])(ray + 0x200);
          auVar72 = vblendmps_avx512f(local_a7c0,local_9f40);
          bVar57 = (bool)((byte)uVar59 & 1);
          bVar6 = (bool)((byte)(uVar59 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar59 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar59 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar59 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar59 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar59 >> 6) & 1);
          bVar12 = (bool)((byte)(uVar59 >> 7) & 1);
          bVar13 = (byte)(uVar59 >> 8);
          bVar14 = (bool)(bVar13 >> 1 & 1);
          bVar15 = (bool)(bVar13 >> 2 & 1);
          bVar16 = (bool)(bVar13 >> 3 & 1);
          bVar17 = (bool)(bVar13 >> 4 & 1);
          bVar18 = (bool)(bVar13 >> 5 & 1);
          bVar19 = (bool)(bVar13 >> 6 & 1);
          *(uint *)(ray + 0x200) = (uint)bVar57 * auVar72._0_4_ | (uint)!bVar57 * local_a580._0_4_;
          *(uint *)(ray + 0x204) = (uint)bVar6 * auVar72._4_4_ | (uint)!bVar6 * local_a580._4_4_;
          *(uint *)(ray + 0x208) = (uint)bVar7 * auVar72._8_4_ | (uint)!bVar7 * local_a580._8_4_;
          *(uint *)(ray + 0x20c) = (uint)bVar8 * auVar72._12_4_ | (uint)!bVar8 * local_a580._12_4_;
          *(uint *)(ray + 0x210) = (uint)bVar9 * auVar72._16_4_ | (uint)!bVar9 * local_a580._16_4_;
          *(uint *)(ray + 0x214) = (uint)bVar10 * auVar72._20_4_ | (uint)!bVar10 * local_a580._20_4_
          ;
          *(uint *)(ray + 0x218) = (uint)bVar11 * auVar72._24_4_ | (uint)!bVar11 * local_a580._24_4_
          ;
          *(uint *)(ray + 0x21c) = (uint)bVar12 * auVar72._28_4_ | (uint)!bVar12 * local_a580._28_4_
          ;
          *(uint *)(ray + 0x220) =
               (uint)(bVar13 & 1) * auVar72._32_4_ | (uint)!(bool)(bVar13 & 1) * local_a580._32_4_;
          *(uint *)(ray + 0x224) = (uint)bVar14 * auVar72._36_4_ | (uint)!bVar14 * local_a580._36_4_
          ;
          *(uint *)(ray + 0x228) = (uint)bVar15 * auVar72._40_4_ | (uint)!bVar15 * local_a580._40_4_
          ;
          *(uint *)(ray + 0x22c) = (uint)bVar16 * auVar72._44_4_ | (uint)!bVar16 * local_a580._44_4_
          ;
          *(uint *)(ray + 0x230) = (uint)bVar17 * auVar72._48_4_ | (uint)!bVar17 * local_a580._48_4_
          ;
          *(uint *)(ray + 0x234) = (uint)bVar18 * auVar72._52_4_ | (uint)!bVar18 * local_a580._52_4_
          ;
          *(uint *)(ray + 0x238) = (uint)bVar19 * auVar72._56_4_ | (uint)!bVar19 * local_a580._56_4_
          ;
          *(uint *)(ray + 0x23c) =
               (uint)(bVar13 >> 7) * auVar72._60_4_ | (uint)!(bool)(bVar13 >> 7) * local_a580._60_4_
          ;
          auVar74 = vpmovm2d_avx512dq((ulong)uVar59);
          _local_a980 = vmovdqa64_avx512f(auVar74);
          local_a930.valid = (int *)local_a980;
          local_a930.geometryUserPtr = local_a9d0->userPtr;
          local_a930.context = local_a9d8->user;
          local_a930.ray = (RTCRayN *)ray;
          local_a930.hit = (RTCHitN *)&local_a780;
          local_a930.N = 0x10;
          if (local_a9d0->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*local_a9d0->occlusionFilterN)(&local_a930);
            auVar74 = vmovdqa64_avx512f(_local_a980);
          }
          lVar61 = local_a9b0;
          uVar23 = vptestmd_avx512f(auVar74,auVar74);
          if ((short)uVar23 == 0) {
            uVar58 = 0;
            auVar76 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar72 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
            auVar71 = vxorps_avx512vl(auVar71,auVar71);
            auVar73 = ZEXT1664(auVar71);
            auVar112 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
            uVar60 = local_a900._0_4_;
          }
          else {
            p_Var5 = local_a9d8->args->filter;
            if (p_Var5 == (RTCFilterFunctionN)0x0) {
              auVar76 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
              auVar72 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
              auVar71 = vxorps_avx512vl(auVar71,auVar71);
              auVar73 = ZEXT1664(auVar71);
              auVar112 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
            }
            else {
              auVar76 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
              auVar72 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
              auVar71 = vxorps_avx512vl(auVar71,auVar71);
              auVar73 = ZEXT1664(auVar71);
              auVar112 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
              if (((local_a9d8->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((local_a9d0->field_8).field_0x2 & 0x40) != 0)
                 ) {
                (*p_Var5)(&local_a930);
                auVar112 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
                auVar71 = vxorps_avx512vl(auVar71,auVar71);
                auVar73 = ZEXT1664(auVar71);
                auVar72 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                auVar76 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                auVar74 = vmovdqa64_avx512f(_local_a980);
              }
            }
            uVar58 = vptestmd_avx512f(auVar74,auVar74);
            auVar74 = vbroadcastss_avx512f(ZEXT416(0xff800000));
            bVar57 = (bool)((byte)uVar58 & 1);
            auVar95._0_4_ =
                 (uint)bVar57 * auVar74._0_4_ | (uint)!bVar57 * *(int *)(local_a930.ray + 0x200);
            bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
            auVar95._4_4_ =
                 (uint)bVar57 * auVar74._4_4_ | (uint)!bVar57 * *(int *)(local_a930.ray + 0x204);
            bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
            auVar95._8_4_ =
                 (uint)bVar57 * auVar74._8_4_ | (uint)!bVar57 * *(int *)(local_a930.ray + 0x208);
            bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
            auVar95._12_4_ =
                 (uint)bVar57 * auVar74._12_4_ | (uint)!bVar57 * *(int *)(local_a930.ray + 0x20c);
            bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
            auVar95._16_4_ =
                 (uint)bVar57 * auVar74._16_4_ | (uint)!bVar57 * *(int *)(local_a930.ray + 0x210);
            bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
            auVar95._20_4_ =
                 (uint)bVar57 * auVar74._20_4_ | (uint)!bVar57 * *(int *)(local_a930.ray + 0x214);
            bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
            auVar95._24_4_ =
                 (uint)bVar57 * auVar74._24_4_ | (uint)!bVar57 * *(int *)(local_a930.ray + 0x218);
            bVar57 = (bool)((byte)(uVar58 >> 7) & 1);
            auVar95._28_4_ =
                 (uint)bVar57 * auVar74._28_4_ | (uint)!bVar57 * *(int *)(local_a930.ray + 0x21c);
            bVar57 = (bool)((byte)(uVar58 >> 8) & 1);
            auVar95._32_4_ =
                 (uint)bVar57 * auVar74._32_4_ | (uint)!bVar57 * *(int *)(local_a930.ray + 0x220);
            bVar57 = (bool)((byte)(uVar58 >> 9) & 1);
            auVar95._36_4_ =
                 (uint)bVar57 * auVar74._36_4_ | (uint)!bVar57 * *(int *)(local_a930.ray + 0x224);
            bVar57 = (bool)((byte)(uVar58 >> 10) & 1);
            auVar95._40_4_ =
                 (uint)bVar57 * auVar74._40_4_ | (uint)!bVar57 * *(int *)(local_a930.ray + 0x228);
            bVar57 = (bool)((byte)(uVar58 >> 0xb) & 1);
            auVar95._44_4_ =
                 (uint)bVar57 * auVar74._44_4_ | (uint)!bVar57 * *(int *)(local_a930.ray + 0x22c);
            bVar57 = (bool)((byte)(uVar58 >> 0xc) & 1);
            auVar95._48_4_ =
                 (uint)bVar57 * auVar74._48_4_ | (uint)!bVar57 * *(int *)(local_a930.ray + 0x230);
            bVar57 = (bool)((byte)(uVar58 >> 0xd) & 1);
            auVar95._52_4_ =
                 (uint)bVar57 * auVar74._52_4_ | (uint)!bVar57 * *(int *)(local_a930.ray + 0x234);
            bVar57 = (bool)((byte)(uVar58 >> 0xe) & 1);
            auVar95._56_4_ =
                 (uint)bVar57 * auVar74._56_4_ | (uint)!bVar57 * *(int *)(local_a930.ray + 0x238);
            bVar57 = SUB81(uVar58 >> 0xf,0);
            auVar95._60_4_ =
                 (uint)bVar57 * auVar74._60_4_ | (uint)!bVar57 * *(int *)(local_a930.ray + 0x23c);
            *(undefined1 (*) [64])(local_a930.ray + 0x200) = auVar95;
            uVar60 = local_a900._0_4_;
          }
          uVar59 = (ushort)uVar58;
          bVar57 = (bool)((byte)uVar58 & 1);
          bVar6 = (bool)((byte)(uVar58 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar58 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar58 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar58 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar58 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar58 >> 6) & 1);
          bVar12 = (bool)((byte)(uVar58 >> 7) & 1);
          bVar14 = (bool)((byte)(uVar58 >> 8) & 1);
          bVar15 = (bool)((byte)(uVar58 >> 9) & 1);
          bVar16 = (bool)((byte)(uVar58 >> 10) & 1);
          bVar17 = (bool)((byte)(uVar58 >> 0xb) & 1);
          bVar18 = (bool)((byte)(uVar58 >> 0xc) & 1);
          bVar19 = (bool)((byte)(uVar58 >> 0xd) & 1);
          bVar20 = (bool)((byte)(uVar58 >> 0xe) & 1);
          bVar21 = SUB81(uVar58 >> 0xf,0);
          *(uint *)local_a9a0 = (uint)bVar57 * *(int *)local_a9a0 | (uint)!bVar57 * local_a7c0._0_4_
          ;
          *(uint *)(local_a9a0 + 4) =
               (uint)bVar6 * *(int *)(local_a9a0 + 4) | (uint)!bVar6 * local_a7c0._4_4_;
          *(uint *)(local_a9a0 + 8) =
               (uint)bVar7 * *(int *)(local_a9a0 + 8) | (uint)!bVar7 * local_a7c0._8_4_;
          *(uint *)(local_a9a0 + 0xc) =
               (uint)bVar8 * *(int *)(local_a9a0 + 0xc) | (uint)!bVar8 * local_a7c0._12_4_;
          *(uint *)(local_a9a0 + 0x10) =
               (uint)bVar9 * *(int *)(local_a9a0 + 0x10) | (uint)!bVar9 * local_a7c0._16_4_;
          *(uint *)(local_a9a0 + 0x14) =
               (uint)bVar10 * *(int *)(local_a9a0 + 0x14) | (uint)!bVar10 * local_a7c0._20_4_;
          *(uint *)(local_a9a0 + 0x18) =
               (uint)bVar11 * *(int *)(local_a9a0 + 0x18) | (uint)!bVar11 * local_a7c0._24_4_;
          *(uint *)(local_a9a0 + 0x1c) =
               (uint)bVar12 * *(int *)(local_a9a0 + 0x1c) | (uint)!bVar12 * local_a7c0._28_4_;
          *(uint *)(local_a9a0 + 0x20) =
               (uint)bVar14 * *(int *)(local_a9a0 + 0x20) | (uint)!bVar14 * local_a7c0._32_4_;
          *(uint *)(local_a9a0 + 0x24) =
               (uint)bVar15 * *(int *)(local_a9a0 + 0x24) | (uint)!bVar15 * local_a7c0._36_4_;
          *(uint *)(local_a9a0 + 0x28) =
               (uint)bVar16 * *(int *)(local_a9a0 + 0x28) | (uint)!bVar16 * local_a7c0._40_4_;
          *(uint *)(local_a9a0 + 0x2c) =
               (uint)bVar17 * *(int *)(local_a9a0 + 0x2c) | (uint)!bVar17 * local_a7c0._44_4_;
          *(uint *)(local_a9a0 + 0x30) =
               (uint)bVar18 * *(int *)(local_a9a0 + 0x30) | (uint)!bVar18 * local_a7c0._48_4_;
          *(uint *)(local_a9a0 + 0x34) =
               (uint)bVar19 * *(int *)(local_a9a0 + 0x34) | (uint)!bVar19 * local_a7c0._52_4_;
          *(uint *)(local_a9a0 + 0x38) =
               (uint)bVar20 * *(int *)(local_a9a0 + 0x38) | (uint)!bVar20 * local_a7c0._56_4_;
          *(uint *)(local_a9a0 + 0x3c) =
               (uint)bVar21 * *(int *)(local_a9a0 + 0x3c) | (uint)!bVar21 * local_a7c0._60_4_;
          lVar62 = local_a9c8;
        }
        uVar58 = (ulong)(uVar60 & (ushort)~uVar59);
      }
      lVar66 = lVar66 + 1;
      context = local_a9d8;
    } while ((short)uVar58 != 0);
    uVar58 = 0;
LAB_01e3e13b:
    lVar61 = lVar61 + 1;
    uVar59 = (ushort)uVar58 & (ushort)local_a9e0;
    local_a9e0 = (uint)CONCAT62((int6)(uVar58 >> 0x10),uVar59);
  } while (uVar59 != 0);
  local_a9e0 = 0;
LAB_01e3e157:
  local_a9f8 = local_a9f8 | ~local_a9e0;
  if ((short)local_a9f8 == -1) {
    local_a9f8 = 0xffff;
    goto LAB_01e3e296;
  }
  auVar74 = vbroadcastss_avx512f(ZEXT416(0xff800000));
  bVar57 = (bool)((byte)local_a9f8 & 1);
  local_9f80._0_4_ = (uint)bVar57 * auVar74._0_4_ | (uint)!bVar57 * local_9f80._0_4_;
  bVar57 = (bool)((byte)(local_a9f8 >> 1) & 1);
  local_9f80._4_4_ = (uint)bVar57 * auVar74._4_4_ | (uint)!bVar57 * local_9f80._4_4_;
  bVar57 = (bool)((byte)(local_a9f8 >> 2) & 1);
  local_9f80._8_4_ = (uint)bVar57 * auVar74._8_4_ | (uint)!bVar57 * local_9f80._8_4_;
  bVar57 = (bool)((byte)(local_a9f8 >> 3) & 1);
  local_9f80._12_4_ = (uint)bVar57 * auVar74._12_4_ | (uint)!bVar57 * local_9f80._12_4_;
  bVar57 = (bool)((byte)(local_a9f8 >> 4) & 1);
  local_9f80._16_4_ = (uint)bVar57 * auVar74._16_4_ | (uint)!bVar57 * local_9f80._16_4_;
  bVar57 = (bool)((byte)(local_a9f8 >> 5) & 1);
  local_9f80._20_4_ = (uint)bVar57 * auVar74._20_4_ | (uint)!bVar57 * local_9f80._20_4_;
  bVar57 = (bool)((byte)(local_a9f8 >> 6) & 1);
  local_9f80._24_4_ = (uint)bVar57 * auVar74._24_4_ | (uint)!bVar57 * local_9f80._24_4_;
  bVar57 = (bool)((byte)(local_a9f8 >> 7) & 1);
  local_9f80._28_4_ = (uint)bVar57 * auVar74._28_4_ | (uint)!bVar57 * local_9f80._28_4_;
  bVar57 = (bool)((byte)(local_a9f8 >> 8) & 1);
  local_9f80._32_4_ = (uint)bVar57 * auVar74._32_4_ | (uint)!bVar57 * local_9f80._32_4_;
  bVar57 = (bool)((byte)(local_a9f8 >> 9) & 1);
  local_9f80._36_4_ = (uint)bVar57 * auVar74._36_4_ | (uint)!bVar57 * local_9f80._36_4_;
  bVar57 = (bool)((byte)(local_a9f8 >> 10) & 1);
  local_9f80._40_4_ = (uint)bVar57 * auVar74._40_4_ | (uint)!bVar57 * local_9f80._40_4_;
  bVar57 = (bool)((byte)(local_a9f8 >> 0xb) & 1);
  local_9f80._44_4_ = (uint)bVar57 * auVar74._44_4_ | (uint)!bVar57 * local_9f80._44_4_;
  bVar57 = (bool)((byte)(local_a9f8 >> 0xc) & 1);
  local_9f80._48_4_ = (uint)bVar57 * auVar74._48_4_ | (uint)!bVar57 * local_9f80._48_4_;
  bVar57 = (bool)((byte)(local_a9f8 >> 0xd) & 1);
  local_9f80._52_4_ = (uint)bVar57 * auVar74._52_4_ | (uint)!bVar57 * local_9f80._52_4_;
  bVar57 = (bool)((byte)(local_a9f8 >> 0xe) & 1);
  local_9f80._56_4_ = (uint)bVar57 * auVar74._56_4_ | (uint)!bVar57 * local_9f80._56_4_;
  bVar57 = (bool)((byte)(local_a9f8 >> 0xf) & 1);
  local_9f80._60_4_ = (uint)bVar57 * auVar74._60_4_ | (uint)!bVar57 * local_9f80._60_4_;
  goto LAB_01e3d363;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }